

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O3

void rollback_to_zero_test(bool multi_kv)

{
  bool bVar1;
  fdb_kvs_handle *handle;
  fdb_status fVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  __atomic_base<unsigned_long> metalen;
  long extraout_RDX;
  uint uVar8;
  code *pcVar9;
  fdb_doc *ptr_handle;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *ptr_handle_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 fconfig_00;
  timeval *__tv;
  fdb_config *fconfig_01;
  fdb_kvs_handle **ppfVar10;
  long lVar11;
  char *__s;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar13;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar14;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aVar15;
  undefined7 in_register_00000039;
  fdb_kvs_handle *pfVar16;
  fdb_file_handle *pfVar17;
  fdb_doc **ppfVar18;
  fdb_kvs_handle **ppfVar19;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R12;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 unaff_R13;
  ulong uVar20;
  btree *doc;
  long lVar21;
  char *pcVar22;
  fdb_kvs_config *config;
  char *pcVar23;
  uint *puVar24;
  fdb_config *fconfig_02;
  fdb_kvs_handle **ppfVar25;
  char *pcVar26;
  fdb_doc **doc_00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 doc_01;
  fdb_kvs_handle *pfVar27;
  fdb_file_handle *dbfile;
  fdb_kvs_info info;
  fdb_kvs_config kvs_config;
  char kv_name [8];
  timeval __test_begin;
  char metabuf [256];
  char keybuf [256];
  char bodybuf [256];
  fdb_config fconfig;
  fdb_kvs_handle *pfStack_4f80;
  fdb_kvs_handle *pfStack_4f78;
  fdb_file_handle *pfStack_4f70;
  fdb_iterator *pfStack_4f68;
  fdb_doc *pfStack_4f60;
  fdb_kvs_handle *pfStack_4f58;
  timeval tStack_4f50;
  fdb_kvs_config fStack_4f40;
  fdb_config fStack_4f28;
  fdb_config *pfStack_4e30;
  fdb_kvs_handle *pfStack_4e28;
  fdb_kvs_handle *pfStack_4e20;
  fdb_file_handle *pfStack_4e18;
  fdb_kvs_handle *pfStack_4e10;
  char acStack_4e07 [15];
  filemgr *pfStack_4df8;
  docio_handle *pdStack_4df0;
  btreeblk_handle *pbStack_4de8;
  size_t sStack_4de0;
  filemgr *pfStack_4dd8;
  docio_handle *pdStack_4dd0;
  btreeblk_handle *pbStack_4dc8;
  timeval tStack_4dc0;
  undefined1 auStack_4db0 [76];
  uint uStack_4d64;
  char *pcStack_4c70;
  atomic<unsigned_long> aStack_4c68;
  btree *pbStack_4c60;
  fdb_kvs_handle *pfStack_4c58;
  fdb_kvs_handle *pfStack_4c50;
  code *pcStack_4c48;
  uint uStack_4c34;
  fdb_txn *pfStack_4c30;
  fdb_kvs_handle *pfStack_4c28;
  fdb_iterator *pfStack_4c20;
  fdb_snapshot_info_t *pfStack_4c18;
  int iStack_4c0c;
  fdb_kvs_handle *pfStack_4c08;
  fdb_kvs_handle *apfStack_4c00 [3];
  uint64_t uStack_4be8;
  fdb_kvs_config fStack_4be0;
  char acStack_4bc8 [8];
  timeval tStack_4bc0;
  char acStack_4bb0 [256];
  btree bStack_4ab0;
  char acStack_4a60 [256];
  char acStack_4960 [256];
  fdb_config fStack_4860;
  fdb_kvs_handle **ppfStack_4768;
  fdb_kvs_handle **ppfStack_4760;
  fdb_kvs_handle *pfStack_4758;
  fdb_kvs_handle **ppfStack_4750;
  fdb_kvs_handle *pfStack_4748;
  code *pcStack_4740;
  fdb_kvs_handle **ppfStack_4738;
  fdb_kvs_handle *pfStack_4730;
  fdb_kvs_handle *apfStack_4728 [9];
  fdb_kvs_config fStack_46e0;
  timeval tStack_46c8;
  fdb_kvs_handle *apfStack_46b8 [33];
  fdb_config fStack_45b0;
  fdb_kvs_handle *apfStack_44b8 [32];
  fdb_kvs_handle *apfStack_43b8 [32];
  fdb_kvs_handle afStack_42b8 [15];
  fdb_config *pfStack_22b0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_22a0;
  fdb_config *pfStack_2298;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2290;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2288;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_2278;
  fdb_file_handle *pfStack_2270;
  fdb_iterator *pfStack_2268;
  fdb_doc *pfStack_2260;
  fdb_kvs_handle *pfStack_2258;
  undefined1 auStack_224f [15];
  timeval tStack_2240;
  undefined1 auStack_2230 [72];
  fdb_config fStack_21e8;
  timeval *ptStack_20f0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20e8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20e0;
  fdb_config *pfStack_20d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20d0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_20c0;
  fdb_file_handle *pfStack_20b8;
  undefined4 uStack_20ac;
  pthread_t pStack_20a8;
  char acStack_209f [15];
  void *pvStack_2090;
  char *pcStack_2088;
  fdb_config *pfStack_2080;
  uint64_t uStack_2078;
  timeval tStack_2070;
  undefined1 auStack_2060 [16];
  uint64_t uStack_2050;
  fdb_config fStack_1f68;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e68;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e60;
  uint *puStack_1e58;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e48;
  timeval tStack_1e38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e28;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e20;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e10;
  fdb_kvs_handle *pfStack_1e08;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1e00;
  fdb_file_handle *pfStack_1df8;
  uint uStack_1dec;
  fdb_kvs_config afStack_1de8 [2];
  timeval tStack_1da8;
  fdb_kvs_config fStack_1d98;
  fdb_kvs_info fStack_1d78;
  undefined1 auStack_1d48 [32];
  undefined1 uStack_1d28;
  undefined1 uStack_1d1a;
  undefined8 uStack_1d10;
  code *pcStack_1cf0;
  undefined4 uStack_1ce8;
  uint *puStack_1ce0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c50;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c48;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c40;
  hbtrie_func_readkey *phStack_1c38;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c30;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1c28;
  fdb_file_handle *pfStack_1c18;
  int iStack_1c0c;
  fdb_kvs_handle *pfStack_1c08;
  fdb_kvs_handle *pfStack_1c00;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1bf8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1bf0 [5];
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_1bc8;
  char acStack_1bc0 [8];
  fdb_kvs_config fStack_1bb8;
  fdb_kvs_info fStack_1ba0;
  timeval tStack_1b70;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_1b60 [5];
  btree *apbStack_1b38 [5];
  btree *apbStack_1b10 [5];
  btree *apbStack_1ae8 [4];
  fdb_doc *pfStack_1ac8;
  char acStack_1ac0 [256];
  char acStack_19c0 [256];
  char acStack_18c0 [256];
  fdb_config fStack_17c0;
  fdb_doc *pfStack_16c8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_16b8;
  fdb_kvs_config *pfStack_16b0;
  fdb_doc **ppfStack_16a8;
  code *pcStack_16a0;
  undefined1 auStack_1688 [72];
  fdb_kvs_config fStack_1640;
  fdb_doc afStack_1628 [3];
  char acStack_1528 [256];
  char acStack_1428 [264];
  fdb_config fStack_1320;
  fdb_doc *pfStack_1228;
  size_t *psStack_1220;
  fdb_doc *apfStack_d78 [151];
  fdb_kvs_handle *pfStack_8c0;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8b8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_8b0;
  char *pcStack_8a8;
  char *pcStack_8a0;
  code *pcStack_898;
  fdb_kvs_handle *pfStack_888;
  int iStack_87c;
  fdb_kvs_handle *pfStack_878;
  undefined1 auStack_870 [232];
  char acStack_788 [8];
  char acStack_780 [64];
  timeval tStack_740;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aaStack_730 [5];
  btree *apbStack_708 [5];
  btree *apbStack_6e0 [5];
  btree *apbStack_6b8 [5];
  fdb_config fStack_690;
  fdb_kvs_info *pfStack_598;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_590;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 aStack_588;
  fdb_kvs_handle **ppfStack_580;
  fdb_kvs_handle **ppfStack_578;
  code *pcStack_570;
  fdb_file_handle *local_558;
  uint local_54c;
  fdb_kvs_handle *local_548 [4];
  fdb_kvs_info local_528;
  fdb_kvs_config local_4f8;
  char local_4e0 [8];
  timeval local_4d8;
  anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 local_4c8 [5];
  btree *local_4a0 [5];
  btree *local_478 [5];
  btree *local_450 [5];
  char local_428 [256];
  char local_328 [256];
  char local_228 [256];
  fdb_config local_128;
  
  pcStack_570 = (code *)0x119df6;
  gettimeofday((timeval *)(local_4e0 + 8),(__timezone_ptr_t)0x0);
  pcStack_570 = (code *)0x119dfb;
  memleak_start();
  pcStack_570 = (code *)0x119e07;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_570 = (code *)0x119e17;
  fdb_get_default_config();
  pcStack_570 = (code *)0x119e21;
  fdb_get_default_kvs_config();
  local_128.buffercache_size = 0;
  local_128.wal_threshold = 0x400;
  local_128.flags = 1;
  local_128.compaction_threshold = '\0';
  pcStack_570 = (code *)0x119e54;
  local_128.multi_kv_instances = multi_kv;
  fdb_open(&local_558,"./mvcc_test1",&local_128);
  local_54c = (uint)CONCAT71(in_register_00000039,multi_kv);
  if (local_54c == 0) {
    pcStack_570 = (code *)0x119ec3;
    fdb_kvs_open_default(local_558,local_548,&local_4f8);
    lVar11 = 1;
  }
  else {
    ppfVar10 = local_548;
    unaff_R12.seqtree = (btree *)&local_4f8;
    uVar20 = 0;
    do {
      pcStack_570 = (code *)0x119e88;
      sprintf(local_4e0,"kv%d",uVar20 & 0xffffffff);
      pcStack_570 = (code *)0x119e9b;
      fdb_kvs_open(local_558,ppfVar10,local_4e0,(fdb_kvs_config *)unaff_R12.seqtree);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 4);
    lVar11 = 4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  ppfVar10 = (fdb_kvs_handle **)0x0;
  pcVar9 = logCallbackFunc;
  pcVar26 = "rollback_to_zero_test";
  do {
    pfVar16 = local_548[(long)ppfVar10];
    pcStack_570 = (code *)0x119ee9;
    fVar2 = fdb_set_log_callback(pfVar16,logCallbackFunc,"rollback_to_zero_test");
    iVar3 = (int)pfVar16;
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_570 = (code *)0x11a472;
      rollback_to_zero_test();
      goto LAB_0011a472;
    }
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while ((fdb_kvs_handle **)lVar11 != ppfVar10);
  uVar20 = 0;
  do {
    pcStack_570 = (code *)0x119f18;
    sprintf(local_328,"key%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x119f34;
    sprintf(local_428,"meta%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x119f50;
    sprintf(local_228,"body%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x119f63;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x119f6e;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x119f79;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x119f9e;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar20].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar21 = 0;
    do {
      pcStack_570 = (code *)0x119fae;
      fdb_set(local_548[lVar21],(fdb_doc *)local_4c8[uVar20].seqtree);
      lVar21 = lVar21 + 1;
    } while (lVar11 != lVar21);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 5);
  pcStack_570 = (code *)0x119fd2;
  fdb_commit(local_558,'\x01');
  uVar20 = 5;
  do {
    pcStack_570 = (code *)0x119ff4;
    sprintf(local_328,"key%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a010;
    sprintf(local_428,"meta%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a02c;
    sprintf(local_228,"body%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a03f;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x11a04a;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x11a055;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x11a07a;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar20].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar21 = 0;
    do {
      pcStack_570 = (code *)0x11a08b;
      fdb_set(local_548[lVar21],(fdb_doc *)local_4c8[uVar20].seqtree);
      lVar21 = lVar21 + 1;
    } while (lVar11 != lVar21);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  pcStack_570 = (code *)0x11a0ac;
  fdb_commit(local_558,'\0');
  uVar20 = 10;
  do {
    pcStack_570 = (code *)0x11a0ce;
    sprintf(local_328,"key%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a0ea;
    sprintf(local_428,"meta%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a106;
    sprintf(local_228,"body%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a119;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x11a124;
    sVar6 = strlen(local_428);
    pcStack_570 = (code *)0x11a12f;
    sVar7 = strlen(local_228);
    pcStack_570 = (code *)0x11a154;
    fdb_doc_create((fdb_doc **)&local_4c8[uVar20].seqtree,local_328,sVar5,local_428,sVar6,local_228,
                   sVar7);
    lVar21 = 0;
    do {
      pcStack_570 = (code *)0x11a165;
      fdb_set(local_548[lVar21],(fdb_doc *)local_4c8[uVar20].seqtree);
      lVar21 = lVar21 + 1;
    } while (lVar11 != lVar21);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0xf);
  pcStack_570 = (code *)0x11a189;
  fdb_commit(local_558,'\x01');
  uVar20 = 0xf;
  do {
    pcStack_570 = (code *)0x11a1ab;
    sprintf(local_328,"key%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a1c7;
    sprintf(local_428,"meta%d",uVar20 & 0xffffffff);
    pcStack_570 = (code *)0x11a1e3;
    sprintf(local_228,"body%d",uVar20 & 0xffffffff);
    unaff_R12.seqtree = (btree *)(local_4c8 + uVar20);
    pcStack_570 = (code *)0x11a1f6;
    sVar5 = strlen(local_328);
    pcStack_570 = (code *)0x11a201;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(local_428);
    pcStack_570 = (code *)0x11a20c;
    sVar6 = strlen(local_228);
    pcStack_570 = (code *)0x11a231;
    fdb_doc_create((fdb_doc **)unaff_R12.seqtree,local_328,sVar5,local_428,(size_t)unaff_R13,
                   local_228,sVar6);
    ppfVar10 = (fdb_kvs_handle **)0x0;
    do {
      pcStack_570 = (code *)0x11a242;
      fdb_set(local_548[(long)ppfVar10],
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R12.seqtree)->ksize)->
              seqtree);
      ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
    } while ((fdb_kvs_handle **)lVar11 != ppfVar10);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x14);
  pcStack_570 = (code *)0x11a263;
  fdb_commit(local_558,'\0');
  pcVar9 = (code *)(ulong)local_54c;
  if ((char)local_54c != '\0') {
    unaff_R12.seqtree = (btree *)&local_528.doc_count;
    unaff_R13.seqtree = (btree *)&local_528.space_used;
    pcVar9 = (code *)(local_548 + 4);
    pcVar26 = (char *)local_548;
    do {
      ppfVar10 = (fdb_kvs_handle **)pcVar26;
      pcStack_570 = (code *)0x11a290;
      ppfVar25 = ppfVar10;
      fVar2 = fdb_rollback(ppfVar10,0);
      iVar3 = (int)ppfVar25;
      pcVar26 = (char *)ppfVar10;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a477;
      pfVar16 = *ppfVar10;
      pcStack_570 = (code *)0x11a2a6;
      fVar2 = fdb_get_kvs_info(pfVar16,(fdb_kvs_info *)pcVar9);
      iVar3 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a472;
      if (local_528.last_seqnum != 0) {
        pcStack_570 = (code *)0x11a30f;
        rollback_to_zero_test();
      }
      if (local_528.doc_count != 0) {
        pcStack_570 = (code *)0x11a319;
        rollback_to_zero_test();
      }
      if (local_528.space_used != 0) {
        pcStack_570 = (code *)0x11a323;
        rollback_to_zero_test();
      }
      pfVar16 = *ppfVar10;
      pcStack_570 = (code *)0x11a2d6;
      fVar2 = fdb_get(pfVar16,(fdb_doc *)local_4c8[0].seqtree);
      iVar3 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a481;
      pfVar16 = *ppfVar10;
      pcStack_570 = (code *)0x11a2ef;
      fVar2 = fdb_set(pfVar16,(fdb_doc *)local_4c8[0].seqtree);
      iVar3 = (int)pfVar16;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a47c;
      pcVar26 = (char *)(ppfVar10 + 1);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
LAB_0011a3bb:
    pcStack_570 = (code *)0x11a3ca;
    pfVar17 = local_558;
    fVar2 = fdb_commit(local_558,'\x01');
    iVar3 = (int)pfVar17;
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_570 = (code *)0x11a3dc;
      fdb_close(local_558);
      lVar11 = 0;
      do {
        pcStack_570 = (code *)0x11a3eb;
        fdb_doc_free((fdb_doc *)local_4c8[lVar11].seqtree);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x14);
      pcStack_570 = (code *)0x11a3f9;
      fdb_shutdown();
      pcStack_570 = (code *)0x11a3fe;
      memleak_end();
      pcVar26 = "single kv mode:";
      if ((char)local_54c != '\0') {
        pcVar26 = "multiple kv mode:";
      }
      pcStack_570 = (code *)0x11a42e;
      sprintf(local_228,"rollback to zero test %s",pcVar26);
      pcVar26 = "%s PASSED\n";
      if (rollback_to_zero_test(bool)::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pcStack_570 = (code *)0x11a45b;
      fprintf(_stderr,pcVar26,local_228);
      return;
    }
    goto LAB_0011a486;
  }
  ppfVar25 = local_548;
  pcStack_570 = (code *)0x11a331;
  fVar2 = fdb_rollback(ppfVar25,0);
  iVar3 = (int)ppfVar25;
  pcVar26 = (char *)0x14;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a48b;
  pcStack_570 = (code *)0x11a348;
  pfVar16 = local_548[0];
  fVar2 = fdb_get_kvs_info(local_548[0],(fdb_kvs_info *)(local_548 + 4));
  iVar3 = (int)pfVar16;
  if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011a490;
  if (local_528.last_seqnum != 0) {
    pcStack_570 = (code *)0x11a362;
    rollback_to_zero_test();
  }
  if (local_528.doc_count != 0) {
    pcStack_570 = (code *)0x11a374;
    rollback_to_zero_test();
  }
  if (local_528.space_used != 0) {
    pcStack_570 = (code *)0x11a386;
    rollback_to_zero_test();
  }
  pcStack_570 = (code *)0x11a398;
  pfVar16 = local_548[0];
  fVar2 = fdb_get(local_548[0],(fdb_doc *)local_4c8[0].seqtree);
  iVar3 = (int)pfVar16;
  if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011a495;
  pcStack_570 = (code *)0x11a3b3;
  fVar2 = fdb_set(local_548[0],(fdb_doc *)local_4c8[0].seqtree);
  iVar3 = (int)local_548[0];
  if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011a3bb;
  goto LAB_0011a49a;
LAB_0011aacb:
  pcStack_898 = (code *)0x11aad0;
  rollback_to_zero_after_compact_test();
LAB_0011aad0:
  pcStack_898 = (code *)0x11aad5;
  rollback_to_zero_after_compact_test();
LAB_0011aad5:
  pcStack_898 = (code *)0x11aada;
  rollback_to_zero_after_compact_test();
LAB_0011aada:
  pcStack_898 = (code *)0x11aadf;
  rollback_to_zero_after_compact_test();
  goto LAB_0011aadf;
LAB_0011b7d0:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d5;
  rollback_all_test();
LAB_0011b7d5:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7da;
  rollback_all_test();
LAB_0011b7da:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e2;
  rollback_all_test();
  aVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
LAB_0011b7e2:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7e7;
  rollback_all_test();
LAB_0011b7e7:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7ec;
  rollback_all_test();
LAB_0011b7ec:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f1;
  rollback_all_test();
LAB_0011b7f1:
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7f6;
  rollback_all_test();
  goto LAB_0011b7f6;
LAB_0011bfab:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb0;
  rollback_during_ops_test();
LAB_0011bfb0:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfb5;
  rollback_during_ops_test();
  goto LAB_0011bfb5;
LAB_0011c3a8:
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3ad;
  in_memory_snapshot_rollback_test();
  goto LAB_0011c3ad;
LAB_0011c7bd:
  pcStack_4740 = (code *)0x11c7c2;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c2:
  pcStack_4740 = (code *)0x11c7c7;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7c7:
  pcStack_4740 = (code *)0x11c7cc;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7cc:
  pcStack_4740 = (code *)0x11c7d1;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d1:
  pcStack_4740 = (code *)0x11c7d6;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7d6:
  pcStack_4740 = (code *)0x11c7db;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7db:
  pcStack_4740 = (code *)0x11c7e0;
  rollback_drop_multi_files_kvs_test();
  goto LAB_0011c7e0;
LAB_0011cd0f:
  pcStack_4c48 = (code *)0x11cd14;
  rollback_without_seqtree();
  goto LAB_0011cd14;
LAB_0011d0a5:
  pfStack_4e20 = (fdb_kvs_handle *)0x11d0aa;
  tx_crash_recover_test();
LAB_0011d0aa:
  pfStack_4e20 = (fdb_kvs_handle *)0x11d0af;
  tx_crash_recover_test();
  goto LAB_0011d0af;
LAB_0011a472:
  pcStack_570 = (code *)0x11a477;
  rollback_to_zero_test();
LAB_0011a477:
  pcStack_570 = (code *)0x11a47c;
  rollback_to_zero_test();
LAB_0011a47c:
  pcStack_570 = (code *)0x11a481;
  rollback_to_zero_test();
LAB_0011a481:
  pcStack_570 = (code *)0x11a486;
  rollback_to_zero_test();
LAB_0011a486:
  pcStack_570 = (code *)0x11a48b;
  rollback_to_zero_test();
LAB_0011a48b:
  pcStack_570 = (code *)0x11a490;
  rollback_to_zero_test();
LAB_0011a490:
  pcStack_570 = (code *)0x11a495;
  rollback_to_zero_test();
LAB_0011a495:
  pcStack_570 = (code *)0x11a49a;
  rollback_to_zero_test();
LAB_0011a49a:
  pcStack_570 = rollback_to_zero_after_compact_test;
  rollback_to_zero_test();
  pcStack_898 = (code *)0x11a4c1;
  pfStack_598 = (fdb_kvs_info *)pcVar9;
  aStack_590 = unaff_R12;
  aStack_588 = unaff_R13;
  ppfStack_580 = ppfVar10;
  ppfStack_578 = (fdb_kvs_handle **)pcVar26;
  pcStack_570 = (code *)lVar11;
  gettimeofday(&tStack_740,(__timezone_ptr_t)0x0);
  pcStack_898 = (code *)0x11a4cd;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_898 = (code *)0x11a4dd;
  fdb_get_default_config();
  pcStack_898 = (code *)0x11a4ea;
  fdb_get_default_kvs_config();
  fStack_690.buffercache_size = 0;
  fStack_690.wal_threshold = 0x400;
  fStack_690.flags = 1;
  fStack_690.compaction_threshold = '\0';
  pcStack_898 = (code *)0x11a51d;
  fStack_690.multi_kv_instances = (bool)(char)iVar3;
  fdb_open((fdb_file_handle **)&pfStack_888,"./mvcc_test1",&fStack_690);
  iStack_87c = iVar3;
  if (iVar3 == 0) {
    pcStack_898 = (code *)0x11a592;
    fdb_kvs_open_default
              ((fdb_file_handle *)pfStack_888,(fdb_kvs_handle **)auStack_870,
               (fdb_kvs_config *)(auStack_870 + 0xd0));
    pcVar26 = (char *)0x1;
  }
  else {
    ppfVar10 = (fdb_kvs_handle **)auStack_870;
    unaff_R12.seqtree = (btree *)(auStack_870 + 0xd0);
    uVar20 = 0;
    do {
      pcStack_898 = (code *)0x11a554;
      sprintf(acStack_788,"kv%d",uVar20 & 0xffffffff);
      pcStack_898 = (code *)0x11a567;
      fdb_kvs_open((fdb_file_handle *)pfStack_888,ppfVar10,acStack_788,
                   (fdb_kvs_config *)unaff_R12.seqtree);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 4);
    pcVar26 = (char *)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar23 = (char *)0x0;
  pcVar9 = logCallbackFunc;
  pcVar22 = "rollback_to_zero_after_compact_test";
  do {
    pfVar16 = *(fdb_kvs_handle **)(auStack_870 + (long)pcVar23 * 8);
    pcStack_898 = (code *)0x11a5b8;
    fVar2 = fdb_set_log_callback(pfVar16,logCallbackFunc,"rollback_to_zero_after_compact_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      pcStack_898 = (code *)0x11aacb;
      rollback_to_zero_after_compact_test();
      goto LAB_0011aacb;
    }
    pcVar23 = pcVar23 + 1;
  } while (pcVar26 != pcVar23);
  uVar20 = 0;
  do {
    pcStack_898 = (code *)0x11a5e7;
    sprintf(auStack_870 + 0x90,"key%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a5fd;
    sprintf(auStack_870 + 0x50,"meta%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a616;
    sprintf(acStack_780,"body%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a629;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a639;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a649;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a66e;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar20].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar11 = 0;
    do {
      pcStack_898 = (code *)0x11a67f;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar11 * 8),(fdb_doc *)aaStack_730[uVar20].seqtree)
      ;
      lVar11 = lVar11 + 1;
    } while (pcVar26 != (char *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 5);
  pcStack_898 = (code *)0x11a6a3;
  fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
  uVar20 = 5;
  do {
    pcStack_898 = (code *)0x11a6c5;
    sprintf(auStack_870 + 0x90,"key%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a6de;
    sprintf(auStack_870 + 0x50,"meta%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a6fa;
    sprintf(acStack_780,"body%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a70d;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a718;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a723;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a745;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar20].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar11 = 0;
    do {
      pcStack_898 = (code *)0x11a755;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar11 * 8),(fdb_doc *)aaStack_730[uVar20].seqtree)
      ;
      lVar11 = lVar11 + 1;
    } while (pcVar26 != (char *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  pcStack_898 = (code *)0x11a776;
  fdb_commit((fdb_file_handle *)pfStack_888,'\0');
  uVar20 = 10;
  do {
    pcStack_898 = (code *)0x11a798;
    sprintf(auStack_870 + 0x90,"key%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a7b1;
    sprintf(auStack_870 + 0x50,"meta%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a7cd;
    sprintf(acStack_780,"body%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a7e0;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a7eb;
    sVar6 = strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a7f6;
    sVar7 = strlen(acStack_780);
    pcStack_898 = (code *)0x11a818;
    fdb_doc_create((fdb_doc **)&aaStack_730[uVar20].seqtree,auStack_870 + 0x90,sVar5,
                   auStack_870 + 0x50,sVar6,acStack_780,sVar7);
    lVar11 = 0;
    do {
      pcStack_898 = (code *)0x11a828;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + lVar11 * 8),(fdb_doc *)aaStack_730[uVar20].seqtree)
      ;
      lVar11 = lVar11 + 1;
    } while (pcVar26 != (char *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0xf);
  pcStack_898 = (code *)0x11a84c;
  fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
  uVar20 = 0xf;
  do {
    pcStack_898 = (code *)0x11a86e;
    sprintf(auStack_870 + 0x90,"key%d",uVar20 & 0xffffffff);
    pcStack_898 = (code *)0x11a887;
    sprintf(auStack_870 + 0x50,"meta%d",uVar20 & 0xffffffff);
    pcVar23 = acStack_780;
    pcStack_898 = (code *)0x11a8a3;
    sprintf(pcVar23,"body%d",uVar20 & 0xffffffff);
    unaff_R13.seqtree = (btree *)(aaStack_730 + uVar20);
    pcStack_898 = (code *)0x11a8b6;
    sVar5 = strlen(auStack_870 + 0x90);
    pcStack_898 = (code *)0x11a8c1;
    unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(auStack_870 + 0x50);
    pcStack_898 = (code *)0x11a8cc;
    sVar6 = strlen(pcVar23);
    pcStack_898 = (code *)0x11a8ee;
    fdb_doc_create((fdb_doc **)unaff_R13.seqtree,auStack_870 + 0x90,sVar5,auStack_870 + 0x50,
                   (size_t)unaff_R12,pcVar23,sVar6);
    pcVar9 = (code *)0x0;
    do {
      pcStack_898 = (code *)0x11a8fe;
      fdb_set(*(fdb_kvs_handle **)(auStack_870 + (long)pcVar9 * 8),
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R13.seqtree)->ksize)->
              seqtree);
      pcVar9 = (code *)((long)pcVar9 + 1);
    } while ((code *)pcVar26 != pcVar9);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x14);
  pcStack_898 = (code *)0x11a91f;
  fdb_commit((fdb_file_handle *)pfStack_888,'\0');
  pfVar16 = (fdb_kvs_handle *)&pfStack_878;
  pcStack_898 = (code *)0x11a938;
  fVar2 = fdb_open((fdb_file_handle **)pfVar16,"./mvcc_test1",&fStack_690);
  pcVar22 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_898 = (code *)0x11a951;
    pfVar16 = pfStack_878;
    fVar2 = fdb_compact((fdb_file_handle *)pfStack_878,"./mvcc_test2");
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aae4;
    pcStack_898 = (code *)0x11a963;
    fdb_close((fdb_file_handle *)pfStack_878);
    pcVar23 = auStack_870 + 0x30;
    unaff_R12.seqtree = (btree *)(auStack_870 + 0x40);
    pcVar26 = (char *)(ulong)(uint)((int)pcVar26 << 3);
    pcVar22 = (char *)0x0;
    unaff_R13.seqtree = (btree *)(auStack_870 + 0x20);
    do {
      pcVar9 = (code *)(auStack_870 + (long)pcVar22);
      pcStack_898 = (code *)0x11a98a;
      pfVar16 = (fdb_kvs_handle *)pcVar9;
      fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar9,0);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad0;
      pfVar16 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a99d;
      fVar2 = fdb_get_kvs_info(pfVar16,(fdb_kvs_info *)unaff_R13.seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aacb;
      if ((hbtrie *)auStack_870._40_8_ != (hbtrie *)0x0) {
        pcStack_898 = (code *)0x11aa03;
        rollback_to_zero_after_compact_test();
      }
      if ((btree *)auStack_870._48_8_ != (btree *)0x0) {
        pcStack_898 = (code *)0x11aa0d;
        rollback_to_zero_after_compact_test();
      }
      if ((filemgr *)auStack_870._64_8_ != (filemgr *)0x0) {
        pcStack_898 = (code *)0x11aa17;
        rollback_to_zero_after_compact_test();
      }
      pfVar16 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a9cd;
      fVar2 = fdb_get(pfVar16,(fdb_doc *)aaStack_730[0].seqtree);
      if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011aada;
      pfVar16 = *(fdb_kvs_handle **)&((fdb_kvs_handle *)pcVar9)->kvs_config;
      pcStack_898 = (code *)0x11a9e6;
      fVar2 = fdb_set(pfVar16,(fdb_doc *)aaStack_730[0].seqtree);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011aad5;
      pcVar22 = pcVar22 + 8;
    } while (pcVar26 != pcVar22);
    pcStack_898 = (code *)0x11aa28;
    pfVar16 = pfStack_888;
    fVar2 = fdb_commit((fdb_file_handle *)pfStack_888,'\x01');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_898 = (code *)0x11aa3a;
      fdb_close((fdb_file_handle *)pfStack_888);
      lVar11 = 0;
      do {
        pcStack_898 = (code *)0x11aa49;
        fdb_doc_free((fdb_doc *)aaStack_730[lVar11].seqtree);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x14);
      pcStack_898 = (code *)0x11aa57;
      fdb_shutdown();
      pcVar26 = "single kv mode:";
      if ((char)iStack_87c != '\0') {
        pcVar26 = "multiple kv mode:";
      }
      pcStack_898 = (code *)0x11aa87;
      sprintf(acStack_780,"rollback to zero after compact test %s",pcVar26);
      pcVar26 = "%s PASSED\n";
      if (rollback_to_zero_after_compact_test(bool)::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pcStack_898 = (code *)0x11aab4;
      fprintf(_stderr,pcVar26,acStack_780);
      return;
    }
  }
  else {
LAB_0011aadf:
    pcStack_898 = (code *)0x11aae4;
    rollback_to_zero_after_compact_test();
LAB_0011aae4:
    pcStack_898 = (code *)0x11aae9;
    rollback_to_zero_after_compact_test();
  }
  pcStack_898 = rollback_to_wal_test;
  rollback_to_zero_after_compact_test();
  __s = (char *)((ulong)pfVar16 & 0xffffffff);
  pcStack_16a0 = (code *)0x11ab0d;
  pfStack_8c0 = (fdb_kvs_handle *)pcVar9;
  aStack_8b8 = unaff_R12;
  aStack_8b0 = unaff_R13;
  pcStack_8a8 = pcVar22;
  pcStack_8a0 = pcVar23;
  pcStack_898 = (code *)pcVar26;
  gettimeofday((timeval *)(auStack_1688 + 0x38),(__timezone_ptr_t)0x0);
  pcStack_16a0 = (code *)0x11ab12;
  memleak_start();
  pcStack_16a0 = (code *)0x11ab1e;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_16a0 = (code *)0x11ab2e;
  fdb_get_default_config();
  config = &fStack_1640;
  pcStack_16a0 = (code *)0x11ab3b;
  fdb_get_default_kvs_config();
  fStack_1320.buffercache_size = 0;
  fStack_1320.wal_threshold = 0x100;
  fStack_1320.flags = 1;
  fStack_1320.compaction_threshold = '\0';
  auStack_1688._28_4_ = SUB84(pfVar16,0);
  fStack_1320.multi_kv_instances = SUB81(__s,0);
  doc_00 = (fdb_doc **)(auStack_1688 + 8);
  pcStack_16a0 = (code *)0x11ab75;
  fdb_open((fdb_file_handle **)doc_00,"./mvcc_test8",&fStack_1320);
  ptr_handle = (fdb_doc *)auStack_1688;
  pcStack_16a0 = (code *)0x11ab88;
  fdb_kvs_open_default((fdb_file_handle *)auStack_1688._8_8_,(fdb_kvs_handle **)ptr_handle,config);
  pcStack_16a0 = (code *)0x11ab9e;
  fVar2 = fdb_set_log_callback
                    ((fdb_kvs_handle *)auStack_1688._0_8_,logCallbackFunc,"rollback_to_wal_test");
  if (fVar2 == FDB_RESULT_SUCCESS) {
    lVar11 = 0;
    uVar20 = 0;
    do {
      pcStack_16a0 = (code *)0x11abc8;
      sprintf(acStack_1528,"key%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11abe1;
      sprintf(acStack_1428,"meta%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11abf7;
      sprintf((char *)afStack_1628,"body%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11ac0a;
      sVar5 = strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11ac1d;
      sVar6 = strlen(acStack_1428);
      pcStack_16a0 = (code *)0x11ac2a;
      sVar7 = strlen((char *)afStack_1628);
      pcStack_16a0 = (code *)0x11ac4c;
      fdb_doc_create((fdb_doc **)((long)&pfStack_1228 + lVar11),acStack_1528,sVar5,acStack_1428,
                     sVar6,afStack_1628,sVar7);
      pcStack_16a0 = (code *)0x11ac5e;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,(&pfStack_1228)[uVar20]);
      uVar20 = uVar20 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar20 != 300);
    pcStack_16a0 = (code *)0x11ac7e;
    fdb_commit((fdb_file_handle *)auStack_1688._8_8_,'\0');
    lVar11 = 0;
    uVar20 = 0;
    do {
      auStack_1688._40_8_ = (fdb_doc **)((long)&pfStack_1228 + lVar11);
      pcStack_16a0 = (code *)0x11aca0;
      fdb_doc_free((&pfStack_1228)[uVar20]);
      pcStack_16a0 = (code *)0x11acbc;
      sprintf(acStack_1528,"key%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11acd8;
      sprintf(acStack_1428,"META%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11acf1;
      sprintf((char *)afStack_1628,"BODY%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11acf9;
      sVar5 = strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11ad04;
      sVar6 = strlen(acStack_1428);
      pcStack_16a0 = (code *)0x11ad0f;
      sVar7 = strlen((char *)afStack_1628);
      pcStack_16a0 = (code *)0x11ad31;
      fdb_doc_create((fdb_doc **)auStack_1688._40_8_,acStack_1528,sVar5,acStack_1428,sVar6,
                     afStack_1628,sVar7);
      pcStack_16a0 = (code *)0x11ad43;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,(&pfStack_1228)[uVar20]);
      uVar20 = uVar20 + 1;
      lVar11 = lVar11 + 8;
    } while (uVar20 != 0x96);
    pcStack_16a0 = (code *)0x11ad63;
    fdb_commit((fdb_file_handle *)auStack_1688._8_8_,'\0');
    uVar20 = 0x96;
    doc_00 = apfStack_d78;
    do {
      pcStack_16a0 = (code *)0x11ad79;
      fdb_doc_free(*doc_00);
      pcStack_16a0 = (code *)0x11ad95;
      sprintf(acStack_1528,"key%d",uVar20 & 0xffffffff);
      __s = acStack_1428;
      pcStack_16a0 = (code *)0x11adb1;
      sprintf(__s,"Meta%d",uVar20 & 0xffffffff);
      ptr_handle = afStack_1628;
      pcStack_16a0 = (code *)0x11adca;
      sprintf((char *)ptr_handle,"Body%d",uVar20 & 0xffffffff);
      pcStack_16a0 = (code *)0x11add2;
      unaff_R12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1528);
      pcStack_16a0 = (code *)0x11addd;
      unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(__s);
      pcStack_16a0 = (code *)0x11ade8;
      sVar5 = strlen((char *)ptr_handle);
      pcStack_16a0 = (code *)0x11ae08;
      fdb_doc_create(doc_00,acStack_1528,(size_t)unaff_R12,__s,(size_t)unaff_R13,ptr_handle,sVar5);
      pcStack_16a0 = (code *)0x11ae15;
      fdb_set((fdb_kvs_handle *)auStack_1688._0_8_,*doc_00);
      uVar20 = uVar20 + 1;
      doc_00 = doc_00 + 1;
    } while (uVar20 != 300);
    pcStack_16a0 = (code *)0x11ae35;
    fdb_commit((fdb_file_handle *)auStack_1688._8_8_,'\0');
    pcStack_16a0 = (code *)0x11ae44;
    fVar2 = fdb_rollback((fdb_kvs_handle **)auStack_1688,0x1c2);
    config = (fdb_kvs_config *)0x12c;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afa5;
    pcStack_16a0 = (code *)0x11ae75;
    fdb_doc_create((fdb_doc **)(auStack_1688 + 0x10),(void *)psStack_1220[4],*psStack_1220,
                   (void *)0x0,0,(void *)0x0,0);
    pcStack_16a0 = (code *)0x11ae89;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)auStack_1688._0_8_,
                              (fdb_kvs_handle **)(auStack_1688 + 0x20),0x1c2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaa;
    pcStack_16a0 = (code *)0x11aea0;
    fVar2 = fdb_get((fdb_kvs_handle *)auStack_1688._32_8_,(fdb_doc *)auStack_1688._16_8_);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011afaf;
    config = *(fdb_kvs_config **)(auStack_1688._16_8_ + 0x40);
    doc_00 = (fdb_doc **)psStack_1220[8];
    pcStack_16a0 = (code *)0x11aecc;
    iVar3 = bcmp(config,doc_00,*(size_t *)(auStack_1688._16_8_ + 0x10));
    ptr_handle = (fdb_doc *)auStack_1688._16_8_;
    if (iVar3 == 0) {
      if (*(fdb_seqnum_t *)(auStack_1688._16_8_ + 0x28) != 0x12e) {
        pcStack_16a0 = (code *)0x11aef0;
        rollback_to_wal_test();
        auStack_1688._16_8_ = auStack_1688._48_8_;
      }
      pcStack_16a0 = (code *)0x11aefb;
      fdb_doc_free((fdb_doc *)auStack_1688._16_8_);
      pcStack_16a0 = (code *)0x11af05;
      fdb_kvs_close((fdb_kvs_handle *)auStack_1688._32_8_);
      pcStack_16a0 = (code *)0x11af0f;
      fdb_close((fdb_file_handle *)auStack_1688._8_8_);
      lVar11 = 0;
      do {
        pcStack_16a0 = (code *)0x11af1e;
        fdb_doc_free((&pfStack_1228)[lVar11]);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 300);
      pcStack_16a0 = (code *)0x11af2f;
      fdb_shutdown();
      pcStack_16a0 = (code *)0x11af34;
      memleak_end();
      pcVar26 = "single kv mode:";
      if (auStack_1688[0x1c] != '\0') {
        pcVar26 = "multiple kv mode:";
      }
      pcStack_16a0 = (code *)0x11af61;
      sprintf((char *)afStack_1628,"rollback to wal test %s",pcVar26);
      pcVar26 = "%s PASSED\n";
      if (rollback_to_wal_test(bool)::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pcStack_16a0 = (code *)0x11af8e;
      fprintf(_stderr,pcVar26,afStack_1628);
      return;
    }
  }
  else {
    pcStack_16a0 = (code *)0x11afa5;
    rollback_to_wal_test();
LAB_0011afa5:
    pcStack_16a0 = (code *)0x11afaa;
    rollback_to_wal_test();
LAB_0011afaa:
    pcStack_16a0 = (code *)0x11afaf;
    rollback_to_wal_test();
LAB_0011afaf:
    pcStack_16a0 = (code *)0x11afb4;
    rollback_to_wal_test();
  }
  pcStack_16a0 = rollback_all_test;
  ppfVar18 = doc_00;
  rollback_to_wal_test();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe4;
  pfStack_16c8 = ptr_handle;
  aStack_16c0 = unaff_R12;
  aStack_16b8 = unaff_R13;
  pfStack_16b0 = config;
  ppfStack_16a8 = doc_00;
  pcStack_16a0 = (code *)__s;
  gettimeofday(&tStack_1b70,(__timezone_ptr_t)0x0);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11afe9;
  memleak_start();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11aff5;
  system("rm -rf  mvcc_test* > errorlog.txt");
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b005;
  fdb_get_default_config();
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b00f;
  fdb_get_default_kvs_config();
  fStack_17c0.buffercache_size._0_1_ = '\0';
  fStack_17c0.buffercache_size._1_1_ = '\0';
  fStack_17c0.buffercache_size._2_1_ = '\0';
  fStack_17c0.buffercache_size._3_1_ = '\0';
  fStack_17c0.buffercache_size._4_1_ = '\0';
  fStack_17c0.buffercache_size._5_1_ = '\0';
  fStack_17c0.buffercache_size._6_1_ = '\0';
  fStack_17c0.buffercache_size._7_1_ = '\0';
  fStack_17c0.wal_threshold._0_1_ = '\0';
  fStack_17c0.wal_threshold._1_1_ = '\x04';
  fStack_17c0.wal_threshold._2_1_ = '\0';
  fStack_17c0.wal_threshold._3_1_ = '\0';
  fStack_17c0.wal_threshold._4_1_ = '\0';
  fStack_17c0.wal_threshold._5_1_ = '\0';
  fStack_17c0.wal_threshold._6_1_ = '\0';
  fStack_17c0.wal_threshold._7_1_ = '\0';
  fStack_17c0.flags = 1;
  fStack_17c0.compaction_threshold = 0;
  fStack_17c0.block_reusing_threshold = 0;
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b045;
  fStack_17c0.multi_kv_instances = (bool)(char)ppfVar18;
  fdb_open(&pfStack_1c18,"./mvcc_test6",(fdb_config *)(acStack_18c0 + 0x100));
  iStack_1c0c = (int)ppfVar18;
  if (iStack_1c0c == 0) {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0b1;
    fdb_kvs_open_default
              (pfStack_1c18,(fdb_kvs_handle **)&aaStack_1bf0[0].seqtree,
               (fdb_kvs_config *)(acStack_1bc0 + 8));
    aVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
  }
  else {
    ptr_handle_00 = aaStack_1bf0;
    unaff_R12.seqtree = (btree *)(acStack_1bc0 + 8);
    uVar20 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b076;
      sprintf(acStack_1bc0,"kv%d",uVar20 & 0xffffffff);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b089;
      fdb_kvs_open(pfStack_1c18,(fdb_kvs_handle **)&ptr_handle_00->seqtree,acStack_1bc0,
                   (fdb_kvs_config *)unaff_R12.seqtree);
      uVar20 = uVar20 + 1;
      ptr_handle_00 = ptr_handle_00 + 1;
    } while (uVar20 != 4);
    aVar12 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x4;
  }
  pcVar23 = (char *)0x0;
  pcVar9 = logCallbackFunc;
  pcVar26 = "rollback_all_test";
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b0d7;
    fVar2 = fdb_set_log_callback
                      ((fdb_kvs_handle *)aaStack_1bf0[(long)pcVar23].seqtree,logCallbackFunc,
                       "rollback_all_test");
    if (fVar2 != FDB_RESULT_SUCCESS) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7d0;
      rollback_all_test();
      goto LAB_0011b7d0;
    }
    pcVar23 = (char *)((hbtrie_func_readkey *)pcVar23 + 1);
  } while (aVar12.seqtree != (btree *)pcVar23);
  uVar20 = 0;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b106;
    sprintf(acStack_19c0,"key%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b122;
    sprintf(acStack_1ac0,"meta%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b13e;
    sprintf(acStack_18c0,"body%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b151;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b15c;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b167;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b18c;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar20].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar11 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b19c;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar11].seqtree,(fdb_doc *)aaStack_1b60[uVar20].seqtree
             );
      lVar11 = lVar11 + 1;
    } while (aVar12.seqtree != (btree *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 5);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1c0;
  fdb_commit(pfStack_1c18,'\x01');
  uVar20 = 5;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1e2;
    sprintf(acStack_19c0,"key%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b1fe;
    sprintf(acStack_1ac0,"meta%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b21a;
    sprintf(acStack_18c0,"body%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b22d;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b238;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b243;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b268;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar20].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar11 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b279;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar11].seqtree,(fdb_doc *)aaStack_1b60[uVar20].seqtree
             );
      lVar11 = lVar11 + 1;
    } while (aVar12.seqtree != (btree *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 10);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b29a;
  fdb_commit(pfStack_1c18,'\0');
  uVar20 = 10;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2bc;
    sprintf(acStack_19c0,"key%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2d8;
    sprintf(acStack_1ac0,"meta%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b2f4;
    sprintf(acStack_18c0,"body%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b307;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b312;
    sVar6 = strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b31d;
    sVar7 = strlen(acStack_18c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b342;
    fdb_doc_create((fdb_doc **)&aaStack_1b60[uVar20].seqtree,acStack_19c0,sVar5,acStack_1ac0,sVar6,
                   acStack_18c0,sVar7);
    lVar11 = 0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b353;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[lVar11].seqtree,(fdb_doc *)aaStack_1b60[uVar20].seqtree
             );
      lVar11 = lVar11 + 1;
    } while (aVar12.seqtree != (btree *)lVar11);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0xf);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b377;
  fdb_commit(pfStack_1c18,'\x01');
  uVar20 = 0xf;
  do {
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b399;
    sprintf(acStack_19c0,"key%d",uVar20 & 0xffffffff);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3b5;
    sprintf(acStack_1ac0,"meta%d",uVar20 & 0xffffffff);
    aVar15.seqtree = (btree *)acStack_18c0;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3d1;
    sprintf((char *)aVar15.seqtree,"body%d",uVar20 & 0xffffffff);
    unaff_R12.seqtree = (btree *)(aaStack_1b60 + uVar20);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3e4;
    sVar5 = strlen(acStack_19c0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3ef;
    unaff_R13 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)strlen(acStack_1ac0);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b3fa;
    sVar6 = strlen((char *)aVar15.seqtree);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b41f;
    fdb_doc_create((fdb_doc **)unaff_R12.seqtree,acStack_19c0,sVar5,acStack_1ac0,(size_t)unaff_R13,
                   aVar15.seqtree,sVar6);
    pcVar23 = (char *)0x0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b430;
      fdb_set((fdb_kvs_handle *)aaStack_1bf0[(long)pcVar23].seqtree,
              (fdb_doc *)
              ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)&(unaff_R12.seqtree)->ksize)->
              seqtree);
      pcVar23 = (char *)((long)pcVar23 + 1);
    } while (aVar12.seqtree != (btree *)pcVar23);
    uVar20 = uVar20 + 1;
  } while (uVar20 != 0x14);
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b451;
  fdb_commit(pfStack_1c18,'\0');
  aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b465;
  fVar2 = fdb_get_all_snap_markers
                    (pfStack_1c18,(fdb_snapshot_info_t **)&pfStack_1c00,(uint64_t *)&pfStack_1c08);
  pcVar26 = (char *)0x14;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    if ((char)iStack_1c0c == '\0') {
      if (pfStack_1c08 != (fdb_kvs_handle *)0x4) {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b49b;
        rollback_all_test();
      }
    }
    else if (pfStack_1c08 != (fdb_kvs_handle *)0x8) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b489;
      rollback_all_test();
    }
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ae;
    fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
    if ((char)iStack_1c0c == '\0') {
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7fb;
LAB_0011b5f4:
      unaff_R12.seqtree = (btree *)0x0;
      unaff_R13.seqtree = (btree *)&aStack_1bf8;
      pcVar26 = (char *)&aStack_1bc8;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b613;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,
                                 &fStack_1ba0);
        pcVar9 = (code *)aVar15;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7d5;
        if (fStack_1ba0.last_seqnum != 0xf) {
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6c7;
          rollback_all_test();
        }
        if (fStack_1ba0.doc_count != 0xf) {
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6d9;
          rollback_all_test();
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b64b;
        fVar2 = fdb_get((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,pfStack_1ac8);
        if (fVar2 != FDB_RESULT_KEY_NOT_FOUND) goto LAB_0011b7d0;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b673;
        fVar2 = fdb_get_kv((fdb_kvs_handle *)aaStack_1bf0[(long)unaff_R12].seqtree,
                           (aaStack_1b60[0].seqtrie)->aux,
                           *(size_t *)&(aaStack_1b60[0].seqtree)->ksize,(void **)unaff_R13.seqtree,
                           (size_t *)pcVar26);
        pcVar9 = (code *)aStack_1bf8;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e2;
        pcVar23 = (char *)(aaStack_1b60[0].seqtrie)->readkey;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b69c;
        iVar3 = bcmp(pcVar23,aStack_1bf8.seqtree,(size_t)aStack_1bc8);
        if (iVar3 != 0) goto LAB_0011b7da;
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6ac;
        free(pcVar9);
        unaff_R12.seqtree = (btree *)&(unaff_R12.seqtree)->vsize;
        aVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar9;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar12.seqtree != unaff_R12.seqtree);
      aVar15.seqtree = (btree *)0x0;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b6f2;
        fVar2 = fdb_set((fdb_kvs_handle *)aaStack_1bf0[(long)aVar15].seqtree,
                        (fdb_doc *)aaStack_1b60[0].seqtree);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7e7;
        aVar15.seqtree = (btree *)&(aVar15.seqtree)->vsize;
      } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar12.seqtree != aVar15.seqtree);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b711;
      fVar2 = fdb_commit(pfStack_1c18,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b800;
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b723;
      fdb_close(pfStack_1c18);
      lVar11 = 0;
      do {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b732;
        fdb_doc_free((fdb_doc *)aaStack_1b60[lVar11].seqtree);
        lVar11 = lVar11 + 1;
      } while (lVar11 != 0x14);
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b74a;
      fVar2 = fdb_free_snap_markers((fdb_snapshot_info_t *)pfStack_1c00,(uint64_t)pfStack_1c08);
      aVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x14;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b757;
        fdb_shutdown();
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b75c;
        memleak_end();
        pcVar26 = "single kv mode:";
        if ((char)iStack_1c0c != '\0') {
          pcVar26 = "multiple kv mode:";
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b78c;
        sprintf(acStack_18c0,"rollback all test %s",pcVar26);
        pcVar26 = "%s PASSED\n";
        if (rollback_all_test(bool)::__test_pass != '\0') {
          pcVar26 = "%s FAILED\n";
        }
        aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7b9;
        fprintf(_stderr,pcVar26,acStack_18c0);
        return;
      }
      goto LAB_0011b805;
    }
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b80a;
    aVar15 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x0;
    do {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4ce;
      fdb_kvs_close((fdb_kvs_handle *)aaStack_1bf0[(long)aVar15].seqtree);
      aVar15.seqtree = aVar15.seqtree + 1;
    } while ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)aVar12.seqtree != aVar15.seqtree);
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b4f2;
    fVar2 = fdb_open((fdb_file_handle **)&fStack_1ba0,"./mvcc_test6",
                     (fdb_config *)(acStack_18c0 + 0x100));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b80f;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b518;
    fVar2 = fdb_kvs_open((fdb_file_handle *)fStack_1ba0.name,(fdb_kvs_handle **)&aStack_1bf8.seqtree
                         ,"kv0",(fdb_kvs_config *)(acStack_1bc0 + 8));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b814;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b533;
    fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
    if (fVar2 != FDB_RESULT_KV_STORE_BUSY) goto LAB_0011b819;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b546;
    fVar2 = fdb_kvs_close((fdb_kvs_handle *)aStack_1bf8.seqtree);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b81e;
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b55b;
    fVar2 = fdb_close((fdb_file_handle *)fStack_1ba0.name);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b576;
      fVar2 = fdb_rollback_all(pfStack_1c18,(fdb_snapshot_marker_t)pfStack_1c00->kvs);
      unaff_R13.seqtree = (btree *)aaStack_1bf0;
      if (fVar2 == FDB_RESULT_SUCCESS) {
        pcVar26 = acStack_1bc0;
        pcVar23 = "rollback_all_test";
        aVar15.seqtree = (btree *)0x0;
        unaff_R12 = aVar12;
        do {
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5a7;
          sprintf(pcVar26,"kv%d",aVar15.seqtree);
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5bc;
          fVar2 = fdb_kvs_open(pfStack_1c18,(fdb_kvs_handle **)unaff_R13.seqtree,pcVar26,
                               (fdb_kvs_config *)(acStack_1bc0 + 8));
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7f1;
          aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b5d7;
          fVar2 = fdb_set_log_callback
                            ((fdb_kvs_handle *)
                             ((anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6 *)
                             &(unaff_R13.seqtree)->ksize)->seqtree,logCallbackFunc,
                             "rollback_all_test");
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011b7ec;
          aVar15._0_4_ = aVar15._0_4_ + 1;
          aVar15._4_4_ = 0;
          unaff_R13.seqtree = (btree *)&(unaff_R13.seqtree)->root_bid;
          unaff_R12.seqtree = (btree *)((long)(unaff_R12.seqtree + -1) + 0x37);
        } while (unaff_R12.seqtree != (btree *)0x0);
        goto LAB_0011b5f4;
      }
      goto LAB_0011b7fb;
    }
  }
  else {
LAB_0011b7f6:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b7fb;
    rollback_all_test();
LAB_0011b7fb:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b800;
    rollback_all_test();
LAB_0011b800:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b805;
    rollback_all_test();
LAB_0011b805:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80a;
    rollback_all_test();
LAB_0011b80a:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b80f;
    rollback_all_test();
LAB_0011b80f:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b814;
    rollback_all_test();
LAB_0011b814:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b819;
    rollback_all_test();
LAB_0011b819:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b81e;
    rollback_all_test();
LAB_0011b81e:
    aStack_1c28 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b823;
    rollback_all_test();
  }
  aStack_1c28.seqtree = (btree *)auto_compaction_snapshots_test;
  rollback_all_test();
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b845;
  aStack_1c50 = aVar15;
  aStack_1c48 = unaff_R12;
  aStack_1c40 = unaff_R13;
  phStack_1c38 = (hbtrie_func_readkey *)pcVar23;
  aStack_1c30 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
  aStack_1c28 = aVar12;
  gettimeofday(&tStack_1da8,(__timezone_ptr_t)0x0);
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b84a;
  memleak_start();
  puVar24 = &uStack_1dec;
  uStack_1dec = 0;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b862;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_00.seqtree = (btree *)auStack_1d48;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b872;
  fdb_get_default_config();
  uStack_1d1a = 1;
  uStack_1d28 = 1;
  pcStack_1cf0 = compaction_cb_count;
  uStack_1ce8 = 0x20;
  uStack_1d10 = 1;
  aVar15.seqtree = (btree *)0x155054;
  aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8ac;
  puStack_1ce0 = puVar24;
  fVar2 = fdb_open(&pfStack_1df8,"mvcc_test1",(fdb_config *)fconfig_00.seqtree);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_00.seqtree = (btree *)afStack_1de8;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8c1;
    fdb_get_default_kvs_config();
    fStack_1d98.custom_cmp_param = afStack_1de8[0].custom_cmp_param;
    fStack_1d98.create_if_missing = afStack_1de8[0].create_if_missing;
    fStack_1d98._1_7_ = afStack_1de8[0]._1_7_;
    fStack_1d98.custom_cmp = afStack_1de8[0].custom_cmp;
    aVar15.seqtree = (btree *)&aStack_1e00;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b8e6;
    fVar2 = fdb_kvs_open_default(pfStack_1df8,(fdb_kvs_handle **)aVar15.seqtree,&fStack_1d98);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbcd;
    unaff_R13.seqtree = (btree *)0x155958;
    unaff_R12.seqtree = (btree *)0x0;
    do {
      pcVar26 = (char *)0xcccccccd;
      aVar13.seqtree = (btree *)0x1555bd;
      aVar15.seqtree = (btree *)afStack_1de8;
      iVar3 = unaff_R12._0_4_;
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b91a;
      sprintf((char *)aVar15.seqtree,"%d",unaff_R12.seqtree);
      aVar12 = aStack_1e00;
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b927;
      sVar5 = strlen((char *)aVar15.seqtree);
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b93e;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar12.seqtree,aVar15.seqtree,sVar5,"value",5);
      aVar14.seqtree = unaff_R13.seqtree;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb86;
        auto_compaction_snapshots_test();
LAB_0011bb86:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb8b;
        auto_compaction_snapshots_test();
LAB_0011bb8b:
        fconfig_00 = aVar12;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb90;
        auto_compaction_snapshots_test();
LAB_0011bb90:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb95;
        auto_compaction_snapshots_test();
LAB_0011bb95:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9a;
        auto_compaction_snapshots_test();
        unaff_R13 = aVar14;
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
LAB_0011bb9a:
        aVar14 = unaff_R13;
        unaff_R13 = aVar13;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb9f;
        auto_compaction_snapshots_test();
LAB_0011bb9f:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbac;
        auto_compaction_snapshots_test();
LAB_0011bbac:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbb9;
        aVar15 = fconfig_00;
        auto_compaction_snapshots_test();
LAB_0011bbb9:
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbbe;
        auto_compaction_snapshots_test();
        aVar12 = unaff_R13;
        pcVar26 = (char *)doc_01;
LAB_0011bbbe:
        unaff_R13 = aVar14;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc3;
        auto_compaction_snapshots_test();
LAB_0011bbc3:
        puVar24 = (uint *)afStack_1de8;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbc8;
        auto_compaction_snapshots_test();
        goto LAB_0011bbc8;
      }
      aVar12 = unaff_R12;
      if ((int)((ulong)unaff_R12.seqtree / 10) * 10 == iVar3) {
        aVar15.seqtree = (btree *)0x0;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b96a;
        fVar2 = fdb_commit(pfStack_1df8,'\0');
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb86;
      }
      fconfig_00 = unaff_R12;
      if ((int)((ulong)unaff_R12.seqtree / 100) * 100 == iVar3) {
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b99b;
        fVar2 = fdb_get_kvs_info((fdb_kvs_handle *)aStack_1e00.seqtree,&fStack_1d78);
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)fStack_1d78.last_seqnum;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb8b;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9bd;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1e00.seqtree,&pfStack_1e08,
                                  fStack_1d78.last_seqnum);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb95;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9e3;
        fdb_doc_create((fdb_doc **)&aStack_1e10.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_1e10.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11b9f6;
        fVar2 = fdb_get_byseq(pfStack_1e08,(fdb_doc *)aStack_1e10.seqtree);
        aVar14 = aStack_1e10;
        doc_01.seqtree = (btree *)pcVar26;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb9a;
        pcVar26 = (char *)(aStack_1e10.seqtrie)->aux;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba17;
        sVar5 = strlen(&afStack_1de8[0].create_if_missing);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba25;
        iVar4 = bcmp(pcVar26,afStack_1de8,sVar5);
        doc_01 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
        if (iVar4 != 0) goto LAB_0011bb9f;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba35;
        fdb_doc_free((fdb_doc *)aVar14.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba3f;
        fVar2 = fdb_kvs_close(pfStack_1e08);
        aVar13.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bb90;
        aVar15.seqtree = (btree *)&pfStack_1e08;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba5d;
        fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_1e00.seqtree,
                                  (fdb_kvs_handle **)aVar15.seqtree,0xffffffffffffffff);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbb9;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba83;
        fdb_doc_create((fdb_doc **)&aStack_1e10.seqtree,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
        (aStack_1e10.seqtrie)->btree_blk_ops = (btree_blk_ops *)fconfig_00;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11ba96;
        aVar15 = aStack_1e10;
        fVar2 = fdb_get_byseq(pfStack_1e08,(fdb_doc *)aStack_1e10.seqtree);
        doc_01 = aStack_1e10;
        aVar12.seqtree = unaff_R13.seqtree;
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbbe;
        fconfig_00 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)(aStack_1e10.seqtrie)->aux;
        aVar15.seqtree = (btree *)afStack_1de8;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bab4;
        sVar5 = strlen((char *)aVar15.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bac2;
        iVar4 = bcmp(fconfig_00.seqtree,aVar15.seqtree,sVar5);
        if (iVar4 != 0) goto LAB_0011bbac;
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bad2;
        fdb_doc_free((fdb_doc *)doc_01.seqtree);
        aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11badc;
        fVar2 = fdb_kvs_close(pfStack_1e08);
        pcVar26 = (char *)0xcccccccd;
        aVar12.seqtree = (btree *)0x1555bd;
        if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011baf4;
        goto LAB_0011bbc3;
      }
LAB_0011baf4:
      puVar24 = (uint *)afStack_1de8;
      pcVar26 = (char *)0xcccccccd;
      aVar12.seqtree = (btree *)0x1555bd;
      unaff_R12._0_4_ = iVar3 + 1;
      unaff_R12._4_4_ = 0;
    } while (unaff_R12._0_4_ != 100000);
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb0e;
    fVar2 = fdb_close(pfStack_1df8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bbd2;
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb1b;
    fVar2 = fdb_shutdown();
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb28;
      memleak_end();
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb42;
      sprintf(&afStack_1de8[0].create_if_missing,"auto compaction completed %d times with snapshots"
              ,(ulong)uStack_1dec);
      pcVar26 = "%s PASSED\n";
      if (auto_compaction_snapshots_test()::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bb6f;
      fprintf(_stderr,pcVar26,afStack_1de8);
      return;
    }
  }
  else {
LAB_0011bbc8:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbcd;
    auto_compaction_snapshots_test();
LAB_0011bbcd:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd2;
    auto_compaction_snapshots_test();
LAB_0011bbd2:
    aStack_1e20 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbd7;
    auto_compaction_snapshots_test();
  }
  aStack_1e20.seqtree = (btree *)compaction_cb_count;
  auto_compaction_snapshots_test();
  aVar14.seqtree = aVar15.seqtree & 0xffffffff;
  __tv = &tStack_1e38;
  aStack_1e48 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bbf3;
  aStack_1e28 = fconfig_00;
  aStack_1e20 = aVar12;
  gettimeofday(__tv,(__timezone_ptr_t)0x0);
  if (aVar15._0_4_ == 0x20) {
    if (extraout_RDX == 0) {
      *(int *)&(aStack_1e10.seqtree)->ksize = *(int *)&(aStack_1e10.seqtree)->ksize + 1;
      return;
    }
  }
  else {
    aStack_1e48 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc12;
    compaction_cb_count();
  }
  aStack_1e48.seqtree = (btree *)rollback_during_ops_test;
  compaction_cb_count();
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc37;
  aStack_1e68 = unaff_R12;
  aStack_1e60 = unaff_R13;
  puStack_1e58 = puVar24;
  aStack_1e50 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
  aStack_1e48.seqtree = aVar14.seqtree;
  gettimeofday((timeval *)(acStack_209f + 0x2f),(__timezone_ptr_t)0x0);
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc3c;
  memleak_start();
  uStack_20ac = 10000;
  if (__tv == (timeval *)0x0) {
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc59;
    system("rm -rf  mvcc_test* > errorlog.txt");
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc66;
    fdb_get_default_config();
    fconfig_02 = &fStack_1f68;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc7e;
    memcpy(fconfig_02,auStack_2060,0xf8);
    fStack_1f68.block_reusing_threshold = 0;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bc9d;
    fVar2 = fdb_open(&pfStack_20b8,"mvcc_test1",fconfig_02);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcb2;
      fdb_get_default_kvs_config();
      uStack_2078 = uStack_2050;
      pcStack_2088 = (char *)auStack_2060._0_8_;
      pfStack_2080 = (fdb_config *)auStack_2060._8_8_;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bcd4;
      fVar2 = fdb_kvs_open_default
                        (pfStack_20b8,(fdb_kvs_handle **)&aStack_20c0.seqtree,
                         (fdb_kvs_config *)(acStack_209f + 0x17));
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0df;
      unaff_R13._0_1_ = 1;
      __tv = (timeval *)0x1;
      uVar8 = 0;
      do {
        aVar14._0_4_ = uVar8 + 1;
        aVar14._4_4_ = 0;
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd03;
        sprintf(acStack_209f,"%d",aVar14.seqtree);
        unaff_R12 = aStack_20c0;
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd10;
        sVar5 = strlen(acStack_209f);
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd2b;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R12.seqtree,acStack_209f,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) {
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfab;
          rollback_during_ops_test();
          goto LAB_0011bfab;
        }
        if ((int)((ulong)__tv / 10) * 10 - 1U == uVar8) {
          unaff_R13.seqtree = unaff_R13.seqtree ^ 1;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd66;
          fdb_commit(pfStack_20b8,unaff_R13._0_1_);
        }
        __tv = (timeval *)(ulong)((int)__tv + 1);
        uVar8 = aVar14._0_4_;
      } while (aVar14._0_4_ < 10000);
      aVar14 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x1;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd8b;
      fdb_commit(pfStack_20b8,'\x01');
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bd9a;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_20c0.seqtree,(fdb_kvs_info *)auStack_2060);
      __tv = (timeval *)(auStack_2060 + 8);
      if ((fdb_config *)auStack_2060._8_8_ != (fdb_config *)0x2710) {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdb0;
        rollback_during_ops_test();
      }
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdc8;
      pthread_create(&pStack_20a8,(pthread_attr_t *)0x0,rollback_during_ops_test,&uStack_20ac);
      fconfig_02 = (fdb_config *)0x155958;
      pcVar26 = acStack_209f;
      unaff_R12.seqtree = (btree *)0x1555bd;
      do {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdea;
        sprintf(pcVar26,"%d",aVar14.seqtree);
        unaff_R13 = aStack_20c0;
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bdf7;
        sVar5 = strlen(pcVar26);
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be0e;
        fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar26,sVar5,"value",5);
        if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011bfab;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be2a;
          fVar2 = fdb_commit(pfStack_20b8,'\x01');
          if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS))
          goto LAB_0011bfb0;
        }
        aVar14._0_4_ = aVar14._0_4_ + 1;
        aVar14._4_4_ = 0;
      } while (aVar14._0_4_ != 0x2711);
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be50;
      pthread_join(pStack_20a8,(void **)(acStack_209f + 0xf));
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be73;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20c0.seqtree,"key1",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e4;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11be8a;
      fVar2 = fdb_commit(pfStack_20b8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0e9;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bea4;
      fdb_get_kvs_info((fdb_kvs_handle *)aStack_20c0.seqtree,(fdb_kvs_info *)auStack_2060);
      fconfig_02 = (fdb_config *)auStack_2060._8_8_;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11becb;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20c0.seqtree,"key2",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0ee;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bef6;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_20c0.seqtree,"key3",4,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f3;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf0d;
      fVar2 = fdb_commit(pfStack_20b8,'\x01');
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c0f8;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf22;
      fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_20c0.seqtree,(fdb_seqnum_t)fconfig_02);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf3c;
        fdb_get_kvs_info((fdb_kvs_handle *)aStack_20c0.seqtree,(fdb_kvs_info *)auStack_2060);
        if ((fdb_config *)auStack_2060._8_8_ != fconfig_02) {
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf4d;
          rollback_during_ops_test();
        }
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf57;
        fdb_close(pfStack_20b8);
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf5c;
        fdb_shutdown();
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf61;
        memleak_end();
        pcVar26 = "%s PASSED\n";
        if (rollback_during_ops_test(void*)::__test_pass != '\0') {
          pcVar26 = "%s FAILED\n";
        }
        aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bf92;
        fprintf(_stderr,pcVar26,"rollback during ops test");
        return;
      }
    }
    else {
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0df;
      rollback_during_ops_test();
LAB_0011c0df:
      __tv = (timeval *)auStack_2060;
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e4;
      rollback_during_ops_test();
LAB_0011c0e4:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0e9;
      rollback_during_ops_test();
LAB_0011c0e9:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0ee;
      rollback_during_ops_test();
LAB_0011c0ee:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f3;
      rollback_during_ops_test();
LAB_0011c0f3:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0f8;
      rollback_during_ops_test();
LAB_0011c0f8:
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0fd;
      rollback_during_ops_test();
    }
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c102;
    rollback_during_ops_test();
LAB_0011c102:
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c107;
    rollback_during_ops_test();
  }
  else {
LAB_0011bfb5:
    fconfig_02 = (fdb_config *)auStack_2060;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfc2;
    fdb_get_default_config();
    pcVar26 = (char *)&fStack_1f68;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bfda;
    memcpy(pcVar26,fconfig_02,0xf8);
    fStack_1f68.block_reusing_threshold = 0;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11bff9;
    fVar2 = fdb_open(&pfStack_20b8,"mvcc_test1",(fdb_config *)pcVar26);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c102;
    fconfig_02 = (fdb_config *)auStack_2060;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c00e;
    fdb_get_default_kvs_config();
    uStack_2078 = uStack_2050;
    pcStack_2088 = (char *)auStack_2060._0_8_;
    pfStack_2080 = (fdb_config *)auStack_2060._8_8_;
    aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c031;
    fVar2 = fdb_kvs_open_default
                      (pfStack_20b8,(fdb_kvs_handle **)&aStack_20c0.seqtree,
                       (fdb_kvs_config *)(acStack_209f + 0x17));
    if (fVar2 == FDB_RESULT_SUCCESS) {
      __tv = (timeval *)(long)(int)__tv->tv_sec;
      if (1 < (long)__tv) {
        unaff_R13.seqtree = (btree *)0xcccccccd;
        fconfig_02 = (fdb_config *)0x155958;
        pcVar26 = acStack_209f;
        unaff_R12.seqtree = (btree *)0x1555bd;
        do {
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c06e;
          sprintf(pcVar26,"%d",(ulong)__tv & 0xffffffff);
          aVar14 = aStack_20c0;
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c07b;
          sVar5 = strlen(pcVar26);
          aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c092;
          fVar2 = fdb_set_kv((fdb_kvs_handle *)aVar14.seqtree,pcVar26,sVar5,"value",5);
          if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c10c;
          if ((int)(((ulong)__tv & 0xffffffff) / 10) * -10 + (int)__tv == 0) {
            aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0b8;
            fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_20c0.seqtree,(fdb_seqnum_t)__tv);
            if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c111;
          }
          bVar1 = 2 < (long)__tv;
          __tv = (timeval *)((long)&__tv[-1].tv_usec + 7);
        } while (bVar1);
      }
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0d3;
      fdb_close(pfStack_20b8);
      aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c0da;
      pthread_exit((void *)0x0);
    }
  }
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c10c;
  rollback_during_ops_test();
LAB_0011c10c:
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c111;
  rollback_during_ops_test();
LAB_0011c111:
  aStack_20d0.seqtree = (btree *)in_memory_snapshot_rollback_test;
  rollback_during_ops_test();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c132;
  ptStack_20f0 = __tv;
  aStack_20e8 = unaff_R12;
  aStack_20e0 = unaff_R13;
  pfStack_20d8 = fconfig_02;
  aStack_20d0 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
  gettimeofday((timeval *)(auStack_224f + 0xf),(__timezone_ptr_t)0x0);
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c137;
  memleak_start();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c143;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fconfig_01 = &fStack_21e8;
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c153;
  fdb_get_default_config();
  aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c167;
  fVar2 = fdb_open(&pfStack_2270,"mvcc_test1",fconfig_01);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fconfig_01 = (fdb_config *)(auStack_2230 + 0x30);
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c17f;
    fdb_get_default_kvs_config();
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c191;
    fVar2 = fdb_kvs_open_default
                      (pfStack_2270,(fdb_kvs_handle **)&aStack_2278.seqtree,
                       (fdb_kvs_config *)fconfig_01);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b2;
    fconfig_01 = (fdb_config *)0x1;
    fconfig_02 = (fdb_config *)0x155958;
    pcVar26 = auStack_224f;
    unaff_R12.seqtree = (btree *)0x1555bd;
    do {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1c0;
      sprintf(pcVar26,"%d",fconfig_01);
      unaff_R13 = aStack_2278;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1cd;
      sVar5 = strlen(pcVar26);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1e4;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)unaff_R13.seqtree,pcVar26,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3a8;
        in_memory_snapshot_rollback_test();
        goto LAB_0011c3a8;
      }
      uVar8 = (int)fconfig_01 + 1;
      fconfig_01 = (fdb_config *)(ulong)uVar8;
    } while (uVar8 != 4);
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c1ff;
    fdb_commit(pfStack_2270,'\0');
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c222;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2278.seqtree,"key4",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3b7;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c24d;
    fVar2 = fdb_set_kv((fdb_kvs_handle *)aStack_2278.seqtree,"key5",4,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3bc;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c264;
    fVar2 = fdb_commit(pfStack_2270,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c1;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c27b;
    fVar2 = fdb_rollback((fdb_kvs_handle **)&aStack_2278.seqtree,3);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3c6;
    fconfig_01 = (fdb_config *)auStack_2230;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c295;
    fdb_get_kvs_info((fdb_kvs_handle *)aStack_2278.seqtree,(fdb_kvs_info *)fconfig_01);
    if (auStack_2230._8_8_ != 3) {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2a6;
      in_memory_snapshot_rollback_test();
    }
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2bc;
    fVar2 = fdb_snapshot_open((fdb_kvs_handle *)aStack_2278.seqtree,&pfStack_2258,0xffffffffffffffff
                             );
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3cb;
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c2e4;
    fdb_iterator_init(pfStack_2258,&pfStack_2268,(void *)0x0,0,(void *)0x0,0,0);
    fconfig_01 = (fdb_config *)&pfStack_2260;
    pfStack_2260 = (fdb_doc *)0x0;
    fconfig_02 = (fdb_config *)0x3;
    do {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c303;
      fVar2 = fdb_iterator_get(pfStack_2268,(fdb_doc **)fconfig_01);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c3a8;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c315;
      fdb_doc_free(pfStack_2260);
      pfStack_2260 = (fdb_doc *)0x0;
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c328;
      fVar2 = fdb_iterator_next(pfStack_2268);
      fconfig_02 = (fdb_config *)&fconfig_02[-1].field_0xf7;
    } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
    if (fconfig_02 == (fdb_config *)0x0) {
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c343;
      fdb_iterator_close(pfStack_2268);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c34d;
      fdb_kvs_close(pfStack_2258);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c357;
      fdb_close(pfStack_2270);
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c35c;
      fdb_shutdown();
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c361;
      memleak_end();
      pcVar26 = "%s PASSED\n";
      if (in_memory_snapshot_rollback_test()::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c392;
      fprintf(_stderr,pcVar26,"in-memory snapshot rollback test");
      return;
    }
  }
  else {
LAB_0011c3ad:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b2;
    in_memory_snapshot_rollback_test();
LAB_0011c3b2:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3b7;
    in_memory_snapshot_rollback_test();
LAB_0011c3b7:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3bc;
    in_memory_snapshot_rollback_test();
LAB_0011c3bc:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c1;
    in_memory_snapshot_rollback_test();
LAB_0011c3c1:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3c6;
    in_memory_snapshot_rollback_test();
LAB_0011c3c6:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3cb;
    in_memory_snapshot_rollback_test();
LAB_0011c3cb:
    aStack_2288 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)0x11c3d0;
    in_memory_snapshot_rollback_test();
  }
  aStack_2288.seqtree = (btree *)rollback_drop_multi_files_kvs_test;
  in_memory_snapshot_rollback_test();
  pcStack_4740 = (code *)0x11c3f2;
  pfStack_22b0 = fconfig_01;
  aStack_22a8 = unaff_R12;
  aStack_22a0 = unaff_R13;
  pfStack_2298 = fconfig_02;
  aStack_2290 = (anon_union_8_2_31e36bfd_for__fdb_kvs_handle_6)pcVar26;
  aStack_2288 = aVar14;
  gettimeofday(&tStack_46c8,(__timezone_ptr_t)0x0);
  pcStack_4740 = (code *)0x11c3f7;
  memleak_start();
  pcStack_4740 = (code *)0x11c403;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4740 = (code *)0x11c413;
  fdb_get_default_config();
  pcStack_4740 = (code *)0x11c41d;
  fdb_get_default_kvs_config();
  fStack_45b0.wal_threshold = 0x400;
  fStack_45b0.compaction_mode = 0;
  fStack_45b0.durability_opt = 2;
  pfVar16 = (fdb_kvs_handle *)(apfStack_43b8 + 0x20);
  ppfVar10 = apfStack_46b8;
  pcVar26 = "kvs%d";
  uVar20 = 0;
  ppfVar25 = (fdb_kvs_handle **)0x0;
  do {
    pcStack_4740 = (code *)0x11c45d;
    sprintf((char *)ppfVar10,"mvcc_test%d",(ulong)ppfVar25 & 0xffffffff);
    pcVar23 = (char *)(apfStack_4728 + (long)ppfVar25);
    pcStack_4740 = (code *)0x11c478;
    ppfVar19 = (fdb_kvs_handle **)pcVar23;
    fVar2 = fdb_open((fdb_file_handle **)pcVar23,(char *)ppfVar10,
                     (fdb_config *)(apfStack_46b8 + 0x21));
    iVar3 = (int)ppfVar19;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c7;
    ppfVar19 = (fdb_kvs_handle **)0x0;
    ppfStack_4738 = ppfVar25;
    pfStack_4730 = pfVar16;
    do {
      ppfVar25 = ppfVar19;
      pcStack_4740 = (code *)0x11c49d;
      sprintf((char *)ppfVar10,"kvs%d",(ulong)(uint)((int)ppfVar25 + (int)uVar20));
      pfVar27 = *(fdb_kvs_handle **)pcVar23;
      pcStack_4740 = (code *)0x11c4b0;
      fVar2 = fdb_kvs_open((fdb_file_handle *)pfVar27,(fdb_kvs_handle **)pfVar16,(char *)ppfVar10,
                           (fdb_kvs_config *)(apfStack_4728 + 9));
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pcStack_4740 = (code *)0x11c7bd;
        rollback_drop_multi_files_kvs_test();
        goto LAB_0011c7bd;
      }
      pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).custom_cmp;
      ppfVar19 = (fdb_kvs_handle **)((long)ppfVar25 + 1);
    } while ((char *)((long)ppfVar25 + 1) != (char *)0x80);
    ppfVar25 = (fdb_kvs_handle **)((long)ppfStack_4738 + 1);
    uVar20 = uVar20 + 0x80;
    pfVar16 = (fdb_kvs_handle *)&pfStack_4730[1].bub_ctx.space_used;
  } while (ppfVar25 != (fdb_kvs_handle **)0x8);
  ppfVar25 = apfStack_46b8 + 0x40;
  ppfVar10 = apfStack_43b8;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    uVar20 = 0;
    do {
      pcStack_4740 = (code *)0x11c511;
      sprintf((char *)ppfVar25,"key%08d",uVar20);
      pcStack_4740 = (code *)0x11c524;
      sprintf((char *)ppfVar10,"value%08d",uVar20);
      pcVar26 = (char *)apfStack_43b8[(long)&pfVar16->op_stats];
      pcStack_4740 = (code *)0x11c534;
      sVar5 = strlen((char *)ppfVar25);
      pcVar23 = (char *)(sVar5 + 1);
      pcStack_4740 = (code *)0x11c540;
      sVar5 = strlen((char *)ppfVar10);
      pcStack_4740 = (code *)0x11c555;
      pfVar27 = (fdb_kvs_handle *)pcVar26;
      fVar2 = fdb_set_kv((fdb_kvs_handle *)pcVar26,ppfVar25,(size_t)pcVar23,ppfVar10,sVar5 + 1);
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7bd;
      uVar8 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
  } while (pfVar16 != (fdb_kvs_handle *)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar27 = apfStack_4728[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_4740 = (code *)0x11c583;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\0');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7e5;
    }
    else {
      pcStack_4740 = (code *)0x11c596;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\x01');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ea;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  pcVar23 = "key%08d";
  ppfVar25 = apfStack_46b8 + 0x40;
  ppfVar10 = (fdb_kvs_handle **)0x0;
  do {
    uVar20 = 0;
    do {
      pcStack_4740 = (code *)0x11c5ca;
      sprintf((char *)ppfVar25,"key%08d",uVar20);
      pfVar16 = apfStack_43b8[(long)(ppfVar10 + 4)];
      pcStack_4740 = (code *)0x11c5da;
      sVar5 = strlen((char *)ppfVar25);
      pcStack_4740 = (code *)0x11c5e9;
      pfVar27 = pfVar16;
      fVar2 = fdb_del_kv(pfVar16,ppfVar25,sVar5 + 1);
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7c2;
      uVar8 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar8;
    } while (uVar8 != 10);
    ppfVar10 = (fdb_kvs_handle **)((long)ppfVar10 + 1);
  } while (ppfVar10 != (fdb_kvs_handle **)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar27 = apfStack_4728[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_4740 = (code *)0x11c617;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\0');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7ef;
    }
    else {
      pcStack_4740 = (code *)0x11c62a;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\x01');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f4;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  ppfVar25 = (fdb_kvs_handle **)0xffffffffffffffc0;
  pcVar23 = (char *)(apfStack_43b8 + 0x20);
  do {
    pcStack_4740 = (code *)0x11c657;
    ppfVar19 = (fdb_kvs_handle **)pcVar23;
    fVar2 = fdb_rollback((fdb_kvs_handle **)pcVar23,10);
    iVar3 = (int)ppfVar19;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7cc;
    ppfVar25 = ppfVar25 + 8;
    pcVar23 = (char *)((long)pcVar23 + 0x200);
  } while (ppfVar25 < (fdb_kvs_handle **)0x3c0);
  ppfVar10 = apfStack_4728;
  pcVar23 = "kvs%d";
  ppfVar25 = apfStack_46b8;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    pfVar27 = apfStack_43b8[(long)&pfVar16->op_stats];
    pcStack_4740 = (code *)0x11c697;
    fVar2 = fdb_kvs_close(pfVar27);
    iVar3 = (int)pfVar27;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d6;
    pcStack_4740 = (code *)0x11c6af;
    sprintf((char *)ppfVar25,"kvs%d",(ulong)pfVar16 & 0xffffffff);
    pfVar27 = *ppfVar10;
    pcStack_4740 = (code *)0x11c6bb;
    fVar2 = fdb_kvs_remove((fdb_file_handle *)pfVar27,(char *)ppfVar25);
    iVar3 = (int)pfVar27;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7d1;
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->config).wal_threshold;
    ppfVar10 = ppfVar10 + 1;
  } while (pfVar16 != (fdb_kvs_handle *)0x400);
  pcVar23 = (char *)0x0;
  do {
    pfVar27 = apfStack_4728[(long)pcVar23];
    if (((ulong)pcVar23 & 1) == 0) {
      pcStack_4740 = (code *)0x11c6e7;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\0');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7f9;
    }
    else {
      pcStack_4740 = (code *)0x11c6fa;
      fVar2 = fdb_commit((fdb_file_handle *)pfVar27,'\x01');
      iVar3 = (int)pfVar27;
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7fe;
    }
    pcVar23 = (char *)((long)pcVar23 + 1);
  } while (pcVar23 != (char *)0x8);
  pcVar23 = "mvcc_test_compact%d";
  ppfVar25 = apfStack_46b8;
  pfVar16 = (fdb_kvs_handle *)0x0;
  do {
    pcStack_4740 = (code *)0x11c72d;
    sprintf((char *)ppfVar25,"mvcc_test_compact%d",(ulong)pfVar16 & 0xffffffff);
    pfVar27 = apfStack_4728[(long)pfVar16];
    pcStack_4740 = (code *)0x11c73a;
    fVar2 = fdb_compact((fdb_file_handle *)pfVar27,(char *)ppfVar25);
    iVar3 = (int)pfVar27;
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011c7db;
    pfVar16 = (fdb_kvs_handle *)&(pfVar16->kvs_config).field_0x1;
  } while (pfVar16 != (fdb_kvs_handle *)0x8);
  pcVar23 = (char *)0x0;
  pcStack_4740 = (code *)0x11c754;
  fdb_doc_free((fdb_doc *)0x0);
  while( true ) {
    pfVar27 = apfStack_4728[(long)pcVar23];
    pcStack_4740 = (code *)0x11c75e;
    fVar2 = fdb_close((fdb_file_handle *)pfVar27);
    iVar3 = (int)pfVar27;
    if (fVar2 != FDB_RESULT_SUCCESS) break;
    pcVar23 = (char *)((long)pcVar23 + 1);
    if (pcVar23 == (char *)0x8) {
      pcStack_4740 = (code *)0x11c770;
      fdb_shutdown();
      pcStack_4740 = (code *)0x11c775;
      memleak_end();
      pcVar26 = "%s PASSED\n";
      if (rollback_drop_multi_files_kvs_test()::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pcStack_4740 = (code *)0x11c7a6;
      fprintf(_stderr,pcVar26,"open multi files kvs test");
      return;
    }
  }
LAB_0011c7e0:
  pcStack_4740 = (code *)0x11c7e5;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7e5:
  pcStack_4740 = (code *)0x11c7ea;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ea:
  pcStack_4740 = (code *)0x11c7ef;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7ef:
  pcStack_4740 = (code *)0x11c7f4;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f4:
  pcStack_4740 = (code *)0x11c7f9;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7f9:
  pcStack_4740 = (code *)0x11c7fe;
  rollback_drop_multi_files_kvs_test();
LAB_0011c7fe:
  pcStack_4740 = rollback_without_seqtree;
  rollback_drop_multi_files_kvs_test();
  pcStack_4c48 = (code *)0x11c825;
  ppfStack_4768 = (fdb_kvs_handle **)pcVar23;
  ppfStack_4760 = ppfVar10;
  pfStack_4758 = (fdb_kvs_handle *)pcVar26;
  ppfStack_4750 = ppfVar25;
  pfStack_4748 = pfVar16;
  pcStack_4740 = (code *)uVar20;
  gettimeofday(&tStack_4bc0,(__timezone_ptr_t)0x0);
  pcStack_4c48 = (code *)0x11c82a;
  memleak_start();
  pcStack_4c48 = (code *)0x11c83a;
  fdb_get_default_config();
  pcStack_4c48 = (code *)0x11c844;
  fdb_get_default_kvs_config();
  fStack_4860.flags = 1;
  fStack_4860.block_reusing_threshold = 0;
  fStack_4860.seqtree_opt = 0;
  pcStack_4c48 = (code *)0x11c86a;
  fStack_4860.multi_kv_instances = (bool)(char)iVar3;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcStack_4c48 = (code *)0x11c87e;
  fdb_open((fdb_file_handle **)&pfStack_4c30,"./mvcc_test1",(fdb_config *)(acStack_4960 + 0x100));
  iStack_4c0c = iVar3;
  if (iVar3 == 0) {
    pcStack_4c48 = (code *)0x11c8ea;
    fdb_kvs_open_default((fdb_file_handle *)pfStack_4c30,apfStack_4c00,&fStack_4be0);
    pcVar26 = (char *)0x1;
  }
  else {
    ppfVar10 = apfStack_4c00;
    uVar20 = 0;
    do {
      pcStack_4c48 = (code *)0x11c8af;
      sprintf(acStack_4bc8,"kv%d",uVar20 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c8c2;
      fdb_kvs_open((fdb_file_handle *)pfStack_4c30,ppfVar10,acStack_4bc8,&fStack_4be0);
      uVar20 = uVar20 + 1;
      ppfVar10 = ppfVar10 + 1;
    } while (uVar20 != 3);
    pcVar26 = (char *)0x3;
  }
  uStack_4c34 = 0;
  do {
    uVar20 = 0;
    do {
      pcStack_4c48 = (code *)0x11c916;
      sprintf(acStack_4a60,"key%d",uVar20 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c937;
      sprintf(acStack_4bb0,"meta-%d-%d",(ulong)uStack_4c34,uVar20 & 0xffffffff);
      pcStack_4c48 = (code *)0x11c956;
      sprintf(acStack_4960,"body-%d-%d",(ulong)uStack_4c34,uVar20 & 0xffffffff);
      doc = (btree *)(&bStack_4ab0.ksize + uVar20 * 8);
      pcStack_4c48 = (code *)0x11c969;
      sVar5 = strlen(acStack_4a60);
      pcStack_4c48 = (code *)0x11c979;
      metalen._M_i = strlen(acStack_4bb0);
      pcStack_4c48 = (code *)0x11c984;
      sVar6 = strlen(acStack_4960);
      pcStack_4c48 = (code *)0x11c9a9;
      fdb_doc_create((fdb_doc **)doc,acStack_4a60,sVar5,acStack_4bb0,metalen._M_i,acStack_4960,sVar6
                    );
      pfVar16 = (fdb_kvs_handle *)0x0;
      do {
        pcStack_4c48 = (code *)0x11c9ba;
        fdb_set(apfStack_4c00[(long)pfVar16],*(fdb_doc **)doc);
        pfVar16 = (fdb_kvs_handle *)((long)pfVar16 + 1);
      } while ((fdb_kvs_handle *)pcVar26 != pfVar16);
      pcStack_4c48 = (code *)0x11c9cf;
      fdb_doc_free(*(fdb_doc **)(&bStack_4ab0.ksize + uVar20 * 8));
      uVar20 = uVar20 + 1;
    } while (uVar20 != 10);
    pcStack_4c48 = (code *)0x11c9f3;
    fdb_commit((fdb_file_handle *)pfStack_4c30,~(byte)uStack_4c34 & 1);
    uStack_4c34 = uStack_4c34 + 1;
    pcVar23 = (char *)(ulong)uStack_4c34;
  } while (uStack_4c34 != 5);
  pcStack_4c48 = (code *)0x11ca16;
  fVar2 = fdb_get_all_snap_markers((fdb_file_handle *)pfStack_4c30,&pfStack_4c18,&uStack_4be8);
  pfVar27 = (fdb_kvs_handle *)0xa;
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcStack_4c48 = (code *)0x11ca35;
    fVar2 = fdb_rollback(apfStack_4c00,(pfStack_4c18[3].kvs_markers)->seqnum);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd19;
    pfStack_4c28 = (fdb_kvs_handle *)0x0;
    pcVar23 = acStack_4960;
    pfVar27 = (fdb_kvs_handle *)0x0;
    do {
      pcStack_4c48 = (code *)0x11ca6a;
      fVar2 = fdb_snapshot_open(apfStack_4c00[(long)pfVar27],&pfStack_4c08,0xffffffffffffffff);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccfb:
        pcStack_4c48 = (code *)0x11cd00;
        rollback_without_seqtree();
LAB_0011cd00:
        pcStack_4c48 = (code *)0x11cd05;
        rollback_without_seqtree();
LAB_0011cd05:
        pcStack_4c48 = (code *)0x11cd0a;
        rollback_without_seqtree();
LAB_0011cd0a:
        pcStack_4c48 = (code *)0x11cd0f;
        rollback_without_seqtree();
        goto LAB_0011cd0f;
      }
      pcStack_4c48 = (code *)0x11ca92;
      fVar2 = fdb_iterator_init(pfStack_4c08,&pfStack_4c20,(void *)0x0,0,(void *)0x0,0,0);
      if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccf6:
        pcStack_4c48 = (code *)0x11ccfb;
        rollback_without_seqtree();
        goto LAB_0011ccfb;
      }
      metalen._M_i = 0;
      do {
        pcStack_4c48 = (code *)0x11caac;
        fVar2 = fdb_iterator_get(pfStack_4c20,(fdb_doc **)&pfStack_4c28);
        if (fVar2 != FDB_RESULT_SUCCESS) {
LAB_0011ccd1:
          pcStack_4c48 = (code *)0x11ccd6;
          rollback_without_seqtree();
LAB_0011ccd6:
          pcStack_4c48 = (code *)0x11cce6;
          rollback_without_seqtree();
LAB_0011cce6:
          pcStack_4c48 = (code *)0x11ccf6;
          rollback_without_seqtree();
          goto LAB_0011ccf6;
        }
        pcStack_4c48 = (code *)0x11cacd;
        sprintf(acStack_4a60,"key%d",metalen._M_i);
        if (pfVar27 == (fdb_kvs_handle *)0x0) {
          pcStack_4c48 = (code *)0x11cb1c;
          sprintf(acStack_4bb0,"meta-1-%d",metalen._M_i);
          pcStack_4c48 = (code *)0x11cb30;
          sprintf(pcVar23,"body-1-%d",metalen._M_i);
        }
        else {
          pcStack_4c48 = (code *)0x11caf0;
          sprintf(acStack_4bb0,"meta-%d-%d",4,metalen._M_i);
          pcStack_4c48 = (code *)0x11cb09;
          sprintf(pcVar23,"body-%d-%d",4);
        }
        pfVar16 = pfStack_4c28;
        doc = (btree *)pfStack_4c28->op_stats;
        pcStack_4c48 = (code *)0x11cb4c;
        iVar3 = bcmp(doc,acStack_4a60,*(size_t *)&pfStack_4c28->kvs_config);
        if (iVar3 != 0) {
          pcStack_4c48 = (code *)0x11ccd1;
          rollback_without_seqtree();
          goto LAB_0011ccd1;
        }
        doc = pfVar16->staletree;
        pcStack_4c48 = (code *)0x11cb6c;
        iVar3 = bcmp(doc,acStack_4bb0,(size_t)(pfVar16->kvs_config).custom_cmp);
        if (iVar3 != 0) goto LAB_0011cce6;
        doc = (pfVar16->field_6).seqtree;
        pcStack_4c48 = (code *)0x11cb87;
        iVar3 = bcmp(doc,pcVar23,(size_t)(pfVar16->kvs_config).custom_cmp_param);
        if (iVar3 != 0) goto LAB_0011ccd6;
        pcStack_4c48 = (code *)0x11cb97;
        fdb_doc_free((fdb_doc *)pfVar16);
        pfStack_4c28 = (fdb_kvs_handle *)0x0;
        uVar8 = (int)metalen._M_i + 1;
        metalen._M_i = (__int_type)uVar8;
        pcStack_4c48 = (code *)0x11cbad;
        fVar2 = fdb_iterator_next(pfStack_4c20);
      } while (fVar2 != FDB_RESULT_ITERATOR_FAIL);
      if (uVar8 != 10) goto LAB_0011cd00;
      pcStack_4c48 = (code *)0x11cbca;
      fVar2 = fdb_iterator_close(pfStack_4c20);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd05;
      pcStack_4c48 = (code *)0x11cbdc;
      fVar2 = fdb_kvs_close(pfStack_4c08);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0a;
      pfVar27 = (fdb_kvs_handle *)&(pfVar27->kvs_config).field_0x1;
    } while (pfVar27 != (fdb_kvs_handle *)pcVar26);
    pcVar23 = (char *)0x0;
    do {
      pcStack_4c48 = (code *)0x11cbfc;
      fVar2 = fdb_kvs_close(apfStack_4c00[(long)pcVar23]);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd0f;
      pcVar23 = pcVar23 + 1;
    } while (pcVar26 != pcVar23);
    pcStack_4c48 = (code *)0x11cc1f;
    fVar2 = fdb_rollback_all((fdb_file_handle *)pfStack_4c30,pfStack_4c18[3].marker);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011cd1e;
    pcStack_4c48 = (code *)0x11cc36;
    fVar2 = fdb_free_snap_markers(pfStack_4c18,uStack_4be8);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      pcStack_4c48 = (code *)0x11cc48;
      fdb_close((fdb_file_handle *)pfStack_4c30);
      pcStack_4c48 = (code *)0x11cc4d;
      fdb_shutdown();
      pcStack_4c48 = (code *)0x11cc52;
      memleak_end();
      pcVar26 = "single kv mode:";
      if ((char)iStack_4c0c != '\0') {
        pcVar26 = "multiple kv mode:";
      }
      pcStack_4c48 = (code *)0x11cc82;
      sprintf(acStack_4960,"rollback without seqtree in %s",pcVar26);
      pcVar26 = "%s PASSED\n";
      if (rollback_without_seqtree(bool)::__test_pass != '\0') {
        pcVar26 = "%s FAILED\n";
      }
      pcStack_4c48 = (code *)0x11ccaf;
      fprintf(_stderr,pcVar26,acStack_4960);
      return;
    }
  }
  else {
LAB_0011cd14:
    pcStack_4c48 = (code *)0x11cd19;
    rollback_without_seqtree();
LAB_0011cd19:
    pcStack_4c48 = (code *)0x11cd1e;
    rollback_without_seqtree();
LAB_0011cd1e:
    pcStack_4c48 = (code *)0x11cd23;
    rollback_without_seqtree();
  }
  pcStack_4c48 = tx_crash_recover_test;
  rollback_without_seqtree();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cd45;
  pcStack_4c70 = pcVar23;
  aStack_4c68.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)metalen._M_i;
  pbStack_4c60 = doc;
  pfStack_4c58 = pfVar16;
  pfStack_4c50 = pfVar27;
  pcStack_4c48 = (code *)pcVar26;
  gettimeofday(&tStack_4dc0,(__timezone_ptr_t)0x0);
  pfStack_4e20 = (fdb_kvs_handle *)0x11cd4a;
  memleak_start();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cd56;
  system("rm -rf  mvcc_test* > errorlog.txt");
  pcVar26 = auStack_4db0 + 0x48;
  pfStack_4e20 = (fdb_kvs_handle *)0x11cd66;
  fdb_get_default_config();
  pfStack_4e20 = (fdb_kvs_handle *)0x11cd78;
  fVar2 = fdb_open(&pfStack_4e18,"./mvcc_test2",(fdb_config *)pcVar26);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    pcVar26 = auStack_4db0;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cd8d;
    fdb_get_default_kvs_config();
    pbStack_4dc8 = (btreeblk_handle *)auStack_4db0._16_8_;
    pfStack_4dd8 = (filemgr *)auStack_4db0._0_8_;
    pdStack_4dd0 = (docio_handle *)auStack_4db0._8_8_;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cdae;
    fVar2 = fdb_kvs_open_default(pfStack_4e18,&pfStack_4e10,(fdb_kvs_config *)&pfStack_4dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0b9;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cdc4;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0be;
    pcVar26 = "key%d";
    pfVar16 = (fdb_kvs_handle *)acStack_4e07;
    pfVar27 = (fdb_kvs_handle *)0x1555bd;
    uVar20 = 0;
    do {
      pfStack_4e20 = (fdb_kvs_handle *)0x11cdf0;
      sprintf((char *)pfVar16,"key%d",uVar20);
      handle = pfStack_4e10;
      pfStack_4e20 = (fdb_kvs_handle *)0x11cdfd;
      sVar5 = strlen((char *)pfVar16);
      pfStack_4e20 = (fdb_kvs_handle *)0x11ce14;
      fVar2 = fdb_set_kv(handle,pfVar16,sVar5,"value",5);
      if (fVar2 != FDB_RESULT_SUCCESS) {
        pfStack_4e20 = (fdb_kvs_handle *)0x11d0a5;
        tx_crash_recover_test();
        goto LAB_0011d0a5;
      }
      uVar8 = (int)uVar20 + 1;
      uVar20 = (ulong)uVar8;
    } while (uVar8 != 10);
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce31;
    fVar2 = fdb_end_transaction(pfStack_4e18,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c3;
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce49;
    fdb_compact(pfStack_4e18,"./mvcc_test3");
    pfStack_4e20 = (fdb_kvs_handle *)0x11ce57;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0c8;
    pcVar26 = "key%d";
    pfVar16 = (fdb_kvs_handle *)acStack_4e07;
    uVar8 = 0;
    do {
      pfStack_4e20 = (fdb_kvs_handle *)0x11ce7c;
      sprintf((char *)pfVar16,"key%d",(ulong)uVar8);
      pfVar27 = pfStack_4e10;
      pfStack_4e20 = (fdb_kvs_handle *)0x11ce89;
      sVar5 = strlen((char *)pfVar16);
      pfStack_4e20 = (fdb_kvs_handle *)0x11ce97;
      fVar2 = fdb_del_kv(pfVar27,pfVar16,sVar5);
      if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0a5;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 10);
    pfStack_4e20 = (fdb_kvs_handle *)0x11ceb4;
    fVar2 = fdb_get_file_info(pfStack_4e18,(fdb_file_info *)auStack_4db0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0cd;
    pcVar26 = (char *)((ulong)auStack_4db0._40_8_ / (ulong)uStack_4d64);
    pfStack_4e20 = (fdb_kvs_handle *)0x11cedc;
    fdb_close(pfStack_4e18);
    pfStack_4e20 = (fdb_kvs_handle *)0x11cee1;
    fdb_shutdown();
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf00;
    iVar3 = _disk_dump("./mvcc_test3",(ulong)uStack_4d64 * (long)pcVar26,
                       (ulong)((uStack_4d64 >> 2) + uStack_4d64 * 2));
    if (iVar3 < 0) goto LAB_0011d0d2;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf2a;
    iVar3 = _disk_dump("./mvcc_test2",((long)pcVar26 * 4 + 8) * (ulong)uStack_4d64,
                       (ulong)(uStack_4d64 >> 2));
    if (iVar3 < 0) goto LAB_0011d0d7;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf49;
    fVar2 = fdb_open(&pfStack_4e18,"./mvcc_test3",(fdb_config *)(auStack_4db0 + 0x48));
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0dc;
    pcVar26 = (char *)&pfStack_4df8;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf5e;
    fdb_get_default_kvs_config();
    pbStack_4dc8 = pbStack_4de8;
    pfStack_4dd8 = pfStack_4df8;
    pdStack_4dd0 = pdStack_4df0;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf7f;
    fVar2 = fdb_kvs_open_default(pfStack_4e18,&pfStack_4e10,(fdb_kvs_config *)&pfStack_4dd8);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0e1;
    pfStack_4e20 = (fdb_kvs_handle *)0x11cf95;
    fVar2 = fdb_begin_transaction(pfStack_4e18,'\x03');
    if (fVar2 == FDB_RESULT_SUCCESS) {
      uVar8 = 0;
      do {
        pfStack_4e20 = (fdb_kvs_handle *)0x11cfba;
        sprintf(acStack_4e07,"key%d",(ulong)uVar8);
        pfVar27 = pfStack_4e10;
        pfStack_4e20 = (fdb_kvs_handle *)0x11cfc7;
        sVar5 = strlen(acStack_4e07);
        pfStack_4e20 = (fdb_kvs_handle *)0x11cfd5;
        fVar2 = fdb_del_kv(pfVar27,acStack_4e07,sVar5);
        if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d0aa;
        uVar8 = uVar8 + 1;
      } while (uVar8 != 10);
      pfStack_4e20 = (fdb_kvs_handle *)0x11cfed;
      fdb_abort_transaction(pfStack_4e18);
      pfVar27 = (fdb_kvs_handle *)&pfStack_4df8;
      uVar8 = 0;
      while( true ) {
        pfStack_4e20 = (fdb_kvs_handle *)0x11d014;
        sprintf(acStack_4e07,"key%d",(ulong)uVar8);
        pfVar16 = pfStack_4e10;
        pfStack_4e20 = (fdb_kvs_handle *)0x11d021;
        sVar5 = strlen(acStack_4e07);
        pfStack_4e20 = (fdb_kvs_handle *)0x11d035;
        fVar2 = fdb_get_kv(pfVar16,acStack_4e07,sVar5,(void **)pfVar27,&sStack_4de0);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        pfStack_4e20 = (fdb_kvs_handle *)0x11d043;
        free(pfStack_4df8);
        uVar8 = uVar8 + 1;
        if (uVar8 == 10) {
          pfStack_4e20 = (fdb_kvs_handle *)0x11d053;
          fdb_close(pfStack_4e18);
          pfStack_4e20 = (fdb_kvs_handle *)0x11d058;
          fdb_shutdown();
          pfStack_4e20 = (fdb_kvs_handle *)0x11d05d;
          memleak_end();
          pcVar26 = "%s PASSED\n";
          if (tx_crash_recover_test()::__test_pass != '\0') {
            pcVar26 = "%s FAILED\n";
          }
          pfStack_4e20 = (fdb_kvs_handle *)0x11d08e;
          fprintf(_stderr,pcVar26,"crash recover test");
          return;
        }
      }
LAB_0011d0af:
      pfVar16 = (fdb_kvs_handle *)acStack_4e07;
      pcVar26 = "key%d";
      pfStack_4e20 = (fdb_kvs_handle *)0x11d0b4;
      tx_crash_recover_test();
      goto LAB_0011d0b4;
    }
  }
  else {
LAB_0011d0b4:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0b9;
    tx_crash_recover_test();
LAB_0011d0b9:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0be;
    tx_crash_recover_test();
LAB_0011d0be:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0c3;
    tx_crash_recover_test();
LAB_0011d0c3:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0c8;
    tx_crash_recover_test();
LAB_0011d0c8:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0cd;
    tx_crash_recover_test();
LAB_0011d0cd:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0d2;
    tx_crash_recover_test();
LAB_0011d0d2:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0d7;
    tx_crash_recover_test();
LAB_0011d0d7:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0dc;
    tx_crash_recover_test();
LAB_0011d0dc:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0e1;
    tx_crash_recover_test();
LAB_0011d0e1:
    pfStack_4e20 = (fdb_kvs_handle *)0x11d0e6;
    tx_crash_recover_test();
  }
  pfStack_4e20 = (fdb_kvs_handle *)drop_kv_on_snap_iterator_test;
  tx_crash_recover_test();
  pfStack_4e30 = (fdb_config *)pcVar26;
  pfStack_4e28 = pfVar16;
  pfStack_4e20 = pfVar27;
  gettimeofday(&tStack_4f50,(__timezone_ptr_t)0x0);
  memleak_start();
  fdb_get_default_config();
  fdb_get_default_kvs_config();
  pfStack_4f60 = (fdb_doc *)0x0;
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_open(&pfStack_4f70,"./mvcc_test1",&fStack_4f28);
  fdb_kvs_open_default(pfStack_4f70,&pfStack_4f58,&fStack_4f40);
  fdb_kvs_open(pfStack_4f70,&pfStack_4f78,"kv",&fStack_4f40);
  fVar2 = fdb_set_kv(pfStack_4f78,"a",1,(void *)0x0,0);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_set_kv(pfStack_4f78,"b",1,(void *)0x0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d304;
    fdb_commit(pfStack_4f70,'\x01');
    fVar2 = fdb_snapshot_open(pfStack_4f78,&pfStack_4f80,2);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d30b;
    fVar2 = fdb_iterator_init(pfStack_4f80,&pfStack_4f68,(void *)0x0,0,(void *)0x0,0,0);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d310;
    fVar2 = fdb_kvs_close(pfStack_4f80);
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d315;
    fVar2 = fdb_kvs_close(pfStack_4f78);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d31a;
    fVar2 = fdb_kvs_remove(pfStack_4f70,"kv");
    if (fVar2 == FDB_RESULT_SUCCESS) goto LAB_0011d31f;
    fVar2 = fdb_iterator_get(pfStack_4f68,&pfStack_4f60);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d324;
    fdb_doc_free(pfStack_4f60);
    fVar2 = fdb_iterator_close(pfStack_4f68);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d329;
    fVar2 = fdb_kvs_close(pfStack_4f80);
    if (fVar2 != FDB_RESULT_SUCCESS) goto LAB_0011d32e;
    fVar2 = fdb_kvs_close(pfStack_4f58);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fVar2 = fdb_close(pfStack_4f70);
      if (fVar2 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar26 = "%s PASSED\n";
        if (drop_kv_on_snap_iterator_test()::__test_pass != '\0') {
          pcVar26 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar26,"drop kv other handle test");
        return;
      }
      goto LAB_0011d338;
    }
  }
  else {
    drop_kv_on_snap_iterator_test();
LAB_0011d304:
    drop_kv_on_snap_iterator_test();
LAB_0011d30b:
    drop_kv_on_snap_iterator_test();
LAB_0011d310:
    drop_kv_on_snap_iterator_test();
LAB_0011d315:
    drop_kv_on_snap_iterator_test();
LAB_0011d31a:
    drop_kv_on_snap_iterator_test();
LAB_0011d31f:
    drop_kv_on_snap_iterator_test();
LAB_0011d324:
    drop_kv_on_snap_iterator_test();
LAB_0011d329:
    drop_kv_on_snap_iterator_test();
LAB_0011d32e:
    drop_kv_on_snap_iterator_test();
  }
  drop_kv_on_snap_iterator_test();
LAB_0011d338:
  drop_kv_on_snap_iterator_test();
  concurrent_writer_iterator_test();
  in_memory_snapshot_cleanup_test();
  drop_kv_on_snap_iterator_test();
  rollback_secondary_kvs();
  multi_version_test();
  crash_recovery_test(true);
  crash_recovery_test(false);
  snapshot_test();
  in_memory_snapshot_rollback_test();
  in_memory_snapshot_test();
  in_memory_snapshot_on_dirty_hbtrie_test();
  in_memory_snapshot_compaction_test();
  snapshot_clone_test();
  snapshot_parallel_clone_test();
  snapshot_stats_test();
  snapshot_with_uncomitted_data_test();
  snapshot_markers_in_file_test(true);
  snapshot_markers_in_file_test(false);
  snapshot_with_deletes_test();
  snapshot_without_seqtree(true);
  snapshot_without_seqtree(false);
  rollback_during_ops_test((void *)0x0);
  rollback_forward_seqnum();
  rollback_test(false);
  rollback_test(true);
  rollback_and_snapshot_test();
  rollback_ncommits();
  transaction_test();
  transaction_simple_api_test();
  transaction_in_memory_snapshot_test();
  rollback_prior_to_ops(true);
  rollback_prior_to_ops(false);
  snapshot_concurrent_compaction_test();
  rollback_to_zero_test(true);
  rollback_to_zero_test(false);
  rollback_to_zero_after_compact_test(false);
  rollback_to_zero_after_compact_test(true);
  rollback_all_test(true);
  rollback_all_test(false);
  rollback_to_wal_test(true);
  rollback_to_wal_test(false);
  rollback_drop_multi_files_kvs_test();
  rollback_without_seqtree(true);
  rollback_without_seqtree(false);
  tx_crash_recover_test();
  auto_compaction_snapshots_test();
  return;
}

Assistant:

void rollback_to_zero_test(bool multi_kv)
{
    TEST_INIT();

    memleak_start();

    int i, r;
    int n = 20;
    int num_kvs = 4; // keep this the same as number of fdb_commit() calls
    fdb_file_handle *dbfile;
    fdb_kvs_handle **db = alca(fdb_kvs_handle *, num_kvs);
    fdb_doc **doc = alca(fdb_doc*, n);
    fdb_kvs_info info;
    fdb_status status;

    char keybuf[256], metabuf[256], bodybuf[256];
    char kv_name[8];

    // remove previous mvcc_test files
    r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.buffercache_size = 0;
    fconfig.wal_threshold = 1024;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;
    fconfig.compaction_threshold = 0;
    fconfig.multi_kv_instances = multi_kv;

    // open db
    fdb_open(&dbfile, "./mvcc_test1", &fconfig);

    if (multi_kv) {
        for (r = 0; r < num_kvs; ++r) {
            sprintf(kv_name, "kv%d", r);
            fdb_kvs_open(dbfile, &db[r], kv_name, &kvs_config);
        }
    } else {
        num_kvs = 1;
        fdb_kvs_open_default(dbfile, &db[0], &kvs_config);
    }

    for (r = 0; r < num_kvs; ++r) {
        status = fdb_set_log_callback(db[r], logCallbackFunc,
                                      (void *) "rollback_to_zero_test");
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

   // ------- Setup test ----------------------------------
   // insert documents of 0-4
    for (i=0; i<n/4; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit with a manual WAL flush (these docs go into HB-trie)
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 5 - 9
    for (; i < n/2; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }

    // commit again without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    // insert documents from 10-14 into HB-trie
    for (; i < (n/2 + n/4); i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // manually flush WAL & commit
    fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);

    // insert documents from 15 - 19 on file into the WAL
    for (; i < n; i++){
        sprintf(keybuf, "key%d", i);
        sprintf(metabuf, "meta%d", i);
        sprintf(bodybuf, "body%d", i);
        fdb_doc_create(&doc[i], (void*)keybuf, strlen(keybuf),
            (void*)metabuf, strlen(metabuf), (void*)bodybuf, strlen(bodybuf));
        for (r = 0; r < num_kvs; ++r) {
            fdb_set(db[r], doc[i]);
        }
    }
    // commit without a WAL flush
    fdb_commit(dbfile, FDB_COMMIT_NORMAL);

    if (!multi_kv) {
        status = fdb_rollback(&db[0], 0);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_get_kvs_info(db[0], &info);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        TEST_CHK(info.last_seqnum == 0);
        TEST_CHK(info.doc_count == 0);
        TEST_CHK(info.space_used == 0);
        status = fdb_get(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
        status = fdb_set(db[0], doc[0]);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    } else {
        for (r = 0; r < num_kvs; ++r) {
            status = fdb_rollback(&db[r], 0);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            status = fdb_get_kvs_info(db[r], &info);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            TEST_CHK(info.last_seqnum == 0);
            TEST_CHK(info.doc_count == 0);
            TEST_CHK(info.space_used == 0);
            status = fdb_get(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
            // test normal operation after rollback
            status = fdb_set(db[r], doc[0]);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    // test normal operation after rollbacks manually flush WAL & commit
    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // close db file
    fdb_close(dbfile);

    // free all documents
    for (i=0;i<n;++i){
        fdb_doc_free(doc[i]);
    }

    // free all resources
    fdb_shutdown();

    memleak_end();

    sprintf(bodybuf, "rollback to zero test %s", multi_kv ? "multiple kv mode:"
                                                          : "single kv mode:");
    TEST_RESULT(bodybuf);
}